

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O3

MPP_RET hal_h265e_v580_gen_regs(void *hal,HalEncTask *task)

{
  undefined1 uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  int iVar7;
  EncRcTask *pEVar8;
  long lVar9;
  uint *puVar10;
  long lVar11;
  void *__s;
  uint *puVar12;
  EncRcTask *pEVar13;
  long lVar14;
  long *plVar15;
  RK_U8 aRVar16 [8];
  uint3 uVar17;
  RK_U32 RVar18;
  uint uVar19;
  uint uVar20;
  VepuRgb2YuvCfg *pVVar21;
  byte *pbVar22;
  size_t sVar23;
  void *pvVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  char *fmt;
  hevc_vepu580_control_cfg *reg_ctl;
  byte bVar34;
  short sVar35;
  uint uVar36;
  int iVar37;
  ulong size;
  uint uVar38;
  uint uVar39;
  void *__src;
  RK_U32 *pRVar40;
  uint uVar41;
  uint uVar42;
  RK_U32 *pRVar43;
  ulong uVar44;
  char cVar45;
  uint uVar46;
  short sVar47;
  uint uVar48;
  uint uVar49;
  ulong uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  undefined8 *puVar55;
  undefined8 uVar56;
  uint uVar57;
  int iVar58;
  bool bVar59;
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  
  bVar34 = 0;
  pEVar8 = task->rc_task;
  lVar9 = *(long *)((long)hal + 0xd0);
  puVar10 = *(uint **)((long)hal + 0x80);
  lVar11 = *(long *)((long)hal + 200);
  __s = *(void **)(puVar10 + 6);
  puVar12 = *(uint **)((long)hal + 0x110);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0xa85);
  }
  uVar2 = *(ushort *)(lVar9 + 4);
  uVar3 = *(ushort *)(lVar9 + 6);
  if ((hal_h265e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","frame %d | type %d | start gen regs","hal_h265e_v580_gen_regs",
               (ulong)*puVar10,(ulong)*(uint *)((long)hal + 0xb0));
  }
  memset(__s,0,0x1d08);
  if (1 < *(int *)((long)hal + 0x94)) {
    lVar30 = *(long *)(*(long *)((long)hal + 0x80) + 0x18);
    if (*(int *)(*(long *)((long)hal + 0x80) + 4) == 2) {
      *(undefined8 *)((long)hal + 0x9c) = 0;
      uVar28 = 0x90010;
      uVar27 = 0;
    }
    else {
      uVar27 = *(uint *)((long)hal + 0x9c) & 3;
      uVar28 = 0x90030;
    }
    uVar26 = *(uint *)(lVar30 + 0xe4);
    *(uint *)(lVar30 + 0xe4) = uVar26 & 0xfffffffc | uVar27;
    *(uint *)(lVar30 + 0xe4) =
         (uVar26 & 0xf800ffc0 | uVar27 | uVar28) + (*(uint *)((long)hal + 0xa0) & 3) * 4;
    iVar37 = *(int *)((long)hal + 0x9c);
    *(int *)((long)hal + 0x9c) = iVar37 + 1;
    *(int *)((long)hal + 0xa0) = iVar37;
    if (2 < iVar37) {
      *(undefined4 *)((long)hal + 0x9c) = 0;
    }
  }
  uVar28 = *(uint *)((long)__s + 0x10);
  *(uint *)((long)__s + 0x10) = uVar28 & 0xffffff00;
  *(uint *)((long)__s + 0x10) = uVar28 & 0xfffffc00 | (*(uint *)((long)hal + 0x100) & 3) << 8;
  *(byte *)((long)__s + 0x14) = *(byte *)((long)__s + 0x14) & 0xfc;
  *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffc00 | 0x1f7;
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xe0000000 | 0x8007000;
  *(uint *)((long)__s + 0x34) =
       *(uint *)((long)__s + 0x34) & 0xff00ff7f | (uint)(*(int *)((long)hal + 0xb0) == 0) << 7;
  *(undefined4 *)((long)__s + 0x38) = 0x1fffff;
  *(byte *)((long)__s + 0x54) = *(byte *)((long)__s + 0x54) | 7;
  uVar57 = (uVar2 + 7 >> 3) - 1 & 0x7ff;
  uVar28 = *(uint *)((long)__s + 0xf0);
  *(uint *)((long)__s + 0xf0) = uVar28 & 0xfffff800 | uVar57;
  uVar26 = *(ushort *)(lVar9 + 4) & 7;
  uVar27 = 8 - uVar26;
  if ((*(ushort *)(lVar9 + 4) & 7) == 0) {
    uVar27 = uVar26;
  }
  uVar27 = *(uint *)((long)__s + 0xf4) & 0xffffffc0 | uVar27;
  *(uint *)((long)__s + 0xf4) = uVar27;
  *(uint *)((long)__s + 0xf0) =
       uVar28 & 0xf800f800 | uVar57 | (uint)uVar3 * 0x2000 + 0x7ffe000 & 0x7ff0000;
  uVar26 = *(ushort *)(lVar9 + 6) & 7;
  uVar28 = (8 - uVar26) * 0x10000;
  if ((*(ushort *)(lVar9 + 6) & 7) == 0) {
    uVar28 = uVar26;
  }
  *(uint *)((long)__s + 0xf4) = uVar27 & 0xffc0ffcf | uVar28;
  uVar28 = *(uint *)((long)__s + 0xe0);
  *(uint *)((long)__s + 0xe0) = uVar28 | 1;
  iVar37 = *(int *)(lVar9 + 0x120);
  dVar60 = log2((double)((uVar3 + 0x3f >> 6) * (uVar2 + 0x3f >> 6)));
  dVar60 = ceil(dVar60);
  *(uint *)((long)__s + 0xe0) =
       (((uint)(long)dVar60 & 0x1f) << 0x13 | uVar28 & 0xff07ffeb | 1) + (uint)(iVar37 == 0) * 4 +
       0x10;
  uVar28 = *(uint *)((long)__s + 0x10c);
  *(uint *)((long)__s + 0x10c) = uVar28 & 0xc3ffffff | 0x20000000;
  *(uint *)((long)__s + 0x10c) =
       uVar28 & 0x83ffffff | 0x20000000 | (uint)((*(uint *)(lVar9 + 0x10) & 0xf00000) != 0) << 0x1e;
  *(uint *)((long)__s + 600) =
       *(uint *)((long)__s + 600) & 0xfffffff8 | (uint)(*(int *)((long)hal + 0xb0) != 2) * 3;
  pRVar40 = klut_weight;
  pRVar43 = (RK_U32 *)((long)__s + 0x25c);
  for (lVar30 = 0x18; lVar30 != 0; lVar30 = lVar30 + -1) {
    *pRVar43 = *pRVar40;
    pRVar40 = pRVar40 + (ulong)bVar34 * -2 + 1;
    pRVar43 = pRVar43 + (ulong)bVar34 * -2 + 1;
  }
  uVar2 = *(ushort *)(lVar9 + 4);
  uVar28 = uVar2 & 0x1fc;
  if (0x17f < uVar2) {
    uVar28 = 0x180;
  }
  uVar27 = 0x300;
  if (uVar2 < 0x1bc) {
    uVar27 = uVar28;
  }
  uVar3 = *(ushort *)(lVar9 + 6);
  uVar28 = uVar3 & 0xfc;
  if (0xff < uVar3) {
    uVar28 = 0x100;
  }
  uVar26 = 0x200;
  if (uVar3 < 0x13c) {
    uVar26 = uVar28;
  }
  uVar57 = uVar2 + 0x3f;
  uVar38 = -((-uVar27 & 0xffff) >> 2) >> 2 & 0x3f;
  uVar28 = -((-uVar26 & 0xffff) >> 2) >> 2 & 0x3f;
  sVar35 = (short)((uint)(int)(short)((short)uVar27 + -4) >> 2);
  sVar47 = sVar35 + 3;
  if (-1 < sVar35) {
    sVar47 = sVar35;
  }
  uVar27 = (uint)(int)sVar47 >> 2 & 0xffff;
  cVar45 = (char)(uVar26 + 0x3fc >> 2);
  if (uVar38 < uVar27) {
    uVar27 = uVar38;
  }
  uVar26 = (uint)(byte)((char)(((byte)(cVar45 >> 7) >> 6) + cVar45) >> 2);
  if (uVar26 <= uVar28) {
    uVar28 = uVar26;
  }
  *(uint *)((long)__s + 0x150) =
       (*(uint *)((long)__s + 0x150) & 0xc000) + (uVar28 & 0x3c) * 4 + (uVar27 >> 2) + 0x12f00;
  uVar38 = *(uint *)((long)__s + 0x154) & 0xfff00000;
  uVar26 = uVar38 + 0x80505;
  *(uint *)((long)__s + 0x154) = uVar26;
  if (((*(byte *)(lVar9 + 0x26) & 4) != 0) && (*(int *)((long)hal + 0xb0) != 2)) {
    uVar26 = uVar26 & 0xffc80505;
    if (*(int *)((long)hal + 0xb4) != 2) {
      uVar26 = uVar38 | 0x280505;
    }
    *(uint *)((long)__s + 0x154) = uVar26 | 0x100000;
  }
  uVar26 = uVar57 >> 6;
  if (*(ushort *)(lVar9 + 4) < 0xa81) {
    uVar38 = *(uint *)((long)__s + 0x158) & 0xffff07ff;
    if (*(ushort *)(lVar9 + 4) < 0x801) {
      uVar38 = uVar38 | 0xa000;
    }
    else {
      uVar38 = uVar38 | 0x8000;
    }
  }
  else {
    uVar38 = *(uint *)((long)__s + 0x158) & 0xffff07ff | 0x6000;
  }
  uVar31 = (uVar27 >> 2 & 0xc) + 4 >> 1;
  uVar27 = (uVar28 >> 2) + 3 >> 1 | 1;
  uVar28 = uVar38 >> 0xd & 7;
  if (uVar27 <= uVar28) {
    uVar28 = uVar27;
  }
  iVar37 = uVar26 * 2;
  if (uVar31 < uVar26) {
    iVar37 = uVar31 + 1;
  }
  uVar28 = uVar38 & 0xfffcf800 | iVar37 + (uVar28 - 1) * uVar26 & 0x7ff;
  *(uint *)((long)__s + 0x158) = uVar28;
  uVar57 = uVar57 & 0xffffffc0;
  if ((0x200 < uVar57) &&
     (((uVar27 = 0x10000, uVar57 < 0x401 || (uVar27 = 0x20000, uVar57 < 0x801)) ||
      (uVar27 = 0x30000, uVar57 < 0x1001)))) {
    *(uint *)((long)__s + 0x158) = uVar27 | uVar28;
  }
  uVar28 = *(uint *)((long)__s + 0x180);
  *(uint *)((long)__s + 0x180) = uVar28 & 0xff878003 | 0x7836dc;
  uVar27 = uVar28 & 0xff878000 | 0x7836dc;
  uVar28 = uVar27 + 2;
  if (*(char *)(lVar9 + 0x1e) == '\0') {
    uVar28 = uVar27;
  }
  *(uint *)((long)__s + 0x180) = uVar28 | 0x800000;
  *(uint *)((long)__s + 0x180) =
       uVar28 & 0xfcffb6de | 0x800000 | (*(uint *)(lVar9 + 0x24) & 1) << 0x18;
  uVar28 = 1;
  if (*(int *)((long)hal + 0xb0) == 2) {
    uVar28 = 0x13;
  }
  uVar27 = 3;
  if (*(int *)(lVar9 + 0x124) == 0) {
    uVar27 = uVar28;
  }
  *(uint *)((long)__s + 400) = *(uint *)((long)__s + 400) & 0xffffffc0 | uVar27;
  vepu580_h265_set_hw_address((H265eV580HalContext *)hal,task);
  lVar30 = *(long *)((long)hal + 200);
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xffffff0f | (puVar12[4] & 0xf) << 4;
  uVar28 = (*(uint *)((long)__s + 0xf8) & 0xffffffc3) + (*puVar12 & 0xf) * 4;
  *(uint *)((long)__s + 0xf8) = uVar28;
  uVar27 = puVar12[1];
  *(uint *)((long)__s + 0xf8) = uVar28 & 0xfffffffe | uVar27 & 1;
  uVar28 = (uVar28 & 0xfffffffc | uVar27 & 1) + (puVar12[2] & 1) * 2;
  *(uint *)((long)__s + 0xf8) = uVar28;
  uVar57 = (uint)(*(int *)(lVar30 + 0x24) != 0xc) << 7;
  uVar26 = uVar28 & 0xffffff7f | uVar57;
  *(uint *)((long)__s + 0xf8) = uVar26;
  uVar27 = *(uint *)((long)__s + 0x10c);
  uVar38 = (uint)(0 < *(int *)(lVar30 + 0x58)) << 0x1a;
  *(uint *)((long)__s + 0x10c) = uVar27 & 0xfbffffff | uVar38;
  *(uint *)((long)__s + 0x10c) =
       uVar27 & 0xe3ffffff | uVar38 | (*(uint *)(lVar30 + 0x50) & 3) << 0x1b;
  if ((*(uint *)(lVar30 + 0x24) & 0xfffc) < 0x14 && (*(uint *)(lVar30 + 0x24) & 0xf0000) == 0) {
    uVar26 = uVar26 | 0x40;
  }
  else {
    uVar26 = uVar28 & 0xffffff3f | uVar57 | (uint)(*(int *)(lVar30 + 0x34) == 2) << 6;
  }
  *(uint *)((long)__s + 0xf8) = uVar26;
  if ((*(byte *)(lVar30 + 0x26) & 0xf0) == 0) {
    RVar18 = *(RK_U32 *)(lVar30 + 0x14);
    if (RVar18 != 0) goto LAB_002503c9;
    uVar28 = *puVar12;
    switch(uVar28) {
    case 0:
      RVar18 = *(int *)(lVar30 + 0xc) << 2;
      break;
    case 1:
      RVar18 = *(int *)(lVar30 + 0xc) * 3;
      break;
    case 2:
    case 8:
    case 9:
      RVar18 = *(int *)(lVar30 + 0xc) * 2;
      goto LAB_002503c9;
    default:
      RVar18 = *(RK_U32 *)(lVar30 + 0xc);
      goto LAB_002503cc;
    }
switchD_002503e2_caseD_5:
    sVar35 = (short)((int)RVar18 / 2);
  }
  else {
    RVar18 = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (RVar18 == 0) {
      RVar18 = *(int *)(lVar30 + 0xc) + 0xfU & 0xfffffff0;
    }
LAB_002503c9:
    uVar28 = *puVar12;
LAB_002503cc:
    sVar35 = (short)RVar18;
    switch(uVar28) {
    case 4:
    case 6:
    case 0xd:
      break;
    default:
      goto switchD_002503e2_caseD_5;
    case 0xc:
      sVar35 = sVar35 * 2;
    }
  }
  if ((*(uint *)((long)__s + 0xf8) & 0x3c) < 0xc) {
    pVVar21 = get_rgb2yuv_cfg(*(MppFrameColorRange *)(lVar30 + 0x34),
                              *(MppFrameColorSpace *)(lVar30 + 0x28));
    bVar59 = true;
    if ((hal_h265e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","input color range %d colorspace %d","vepu580_h265_set_pp_regs",
                 (ulong)*(uint *)(lVar30 + 0x34),(ulong)*(uint *)(lVar30 + 0x28));
      bVar59 = (hal_h265e_debug & 2) == 0;
    }
    uVar27 = ((ushort)(pVVar21->_2y).r_coeff & 0x1ff) << 0x12;
    uVar28 = *(uint *)((long)__s + 0xfc);
    *(uint *)((long)__s + 0xfc) = uVar28 & 0xf803ffff | uVar27;
    uVar26 = ((ushort)(pVVar21->_2y).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0xfc) = uVar28 & 0xf80001ff | uVar27 | uVar26;
    *(uint *)((long)__s + 0xfc) =
         uVar28 & 0xf8000000 | uVar27 | uVar26 | (ushort)(pVVar21->_2y).b_coeff & 0x1ff;
    uVar27 = ((ushort)(pVVar21->_2u).r_coeff & 0x1ff) << 0x12;
    uVar28 = *(uint *)((long)__s + 0x100);
    *(uint *)((long)__s + 0x100) = uVar28 & 0xf803ffff | uVar27;
    uVar26 = ((ushort)(pVVar21->_2u).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x100) = uVar28 & 0xf80001ff | uVar27 | uVar26;
    *(uint *)((long)__s + 0x100) =
         uVar28 & 0xf8000000 | uVar27 | uVar26 | (ushort)(pVVar21->_2u).b_coeff & 0x1ff;
    uVar27 = ((ushort)(pVVar21->_2v).r_coeff & 0x1ff) << 0x12;
    uVar28 = *(uint *)((long)__s + 0x104);
    *(uint *)((long)__s + 0x104) = uVar28 & 0xf803ffff | uVar27;
    uVar26 = ((ushort)(pVVar21->_2v).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x104) = uVar28 & 0xf80001ff | uVar27 | uVar26;
    *(uint *)((long)__s + 0x104) =
         uVar28 & 0xf8000000 | uVar27 | uVar26 | (ushort)(pVVar21->_2v).b_coeff & 0x1ff;
    uVar28 = *(uint *)((long)__s + 0x108);
    uVar27 = ((ushort)(pVVar21->_2y).offset & 0x1f) << 0x10;
    *(uint *)((long)__s + 0x108) = uVar28 & 0xffe0ffff | uVar27;
    uVar28 = uVar28 & 0xffe000ff | uVar27 | ((ushort)(pVVar21->_2u).offset & 0xff) << 8;
    *(uint *)((long)__s + 0x108) = uVar28;
    *(uint *)((long)__s + 0x108) = CONCAT31((int3)(uVar28 >> 8),(char)(pVVar21->_2v).offset);
    if (!bVar59) {
      _mpp_log_l(4,"hal_h265e_v580","use color range %d colorspace %d","vepu580_h265_set_pp_regs",
                 (ulong)pVVar21->dst_range,(ulong)pVVar21->color);
    }
  }
  *(uint *)((long)__s + 0x114) = *(uint *)((long)__s + 0x114) & 0xfffe0000 | RVar18 & 0x1ffff;
  *(short *)((long)__s + 0x118) = sVar35;
  pEVar13 = task->rc_task;
  lVar30 = *(long *)((long)hal + 200);
  if (*(int *)(lVar30 + 0x94) == 2) {
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xffffc0ff | ((pEVar13->info).quality_target & 0x3fU) << 8;
    *(uint *)((long)__s + 0x1a0) =
         *(uint *)((long)__s + 0x1a0) & 0xffc0ffff |
         ((pEVar13->info).quality_target & 0x3fU) << 0x10;
    uVar28 = *(uint *)((long)__s + 0x134);
    uVar27 = ((pEVar13->info).quality_target & 0x3fU) << 0x14;
    *(uint *)((long)__s + 0x134) = uVar28 & 0xfc0fffff | uVar27;
    *(uint *)((long)__s + 0x134) =
         uVar28 & 0xfffff | uVar27 | (pEVar13->info).quality_target << 0x1a;
  }
  else {
    uVar26 = *(ushort *)(*(long *)((long)hal + 0xd0) + 4) + 0x3f >> 6;
    uVar27 = ((pEVar13->info).bit_target << 4) /
             (int)((*(ushort *)(*(long *)((long)hal + 0xd0) + 6) + 0x3f >> 6) * uVar26);
    uVar28 = 0x50000;
    if (uVar27 < 0x100000) {
      uVar28 = uVar27;
    }
    uVar57 = (uVar28 * uVar26 >> 4) * 5 >> 4;
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xffffc0ff | ((pEVar13->info).quality_target & 0x3fU) << 8;
    *(uint *)((long)__s + 0x1a0) =
         *(uint *)((long)__s + 0x1a0) & 0xffc0ffff |
         ((pEVar13->info).quality_target & 0x3fU) << 0x10;
    *(uint *)((long)__s + 0x130) = uVar26 * 0x1000 + (*(uint *)((long)__s + 0x130) & 0xff8) + 7;
    uVar26 = (*(uint *)(lVar30 + 0x17c + (ulong)(*(int *)((long)hal + 0xb0) == 2) * 4) & 0xf) <<
             0x10;
    uVar27 = *(uint *)((long)__s + 0x134);
    *(uint *)((long)__s + 0x134) = uVar27 & 0xfff0ffff | uVar26;
    uVar38 = ((pEVar13->info).quality_max & 0x3fU) << 0x14;
    *(uint *)((long)__s + 0x134) = uVar27 & 0xfc00ffff | uVar26 | uVar38;
    uVar31 = (pEVar13->info).quality_min << 0x1a;
    *(uint *)((long)__s + 0x134) = uVar27 & 0xffff | uVar26 | uVar38 | uVar31;
    *(uint *)((long)__s + 0x138) = *(uint *)((long)__s + 0x138) & 0xfff00000 | uVar28 & 0xfffff;
    *(uint *)((long)__s + 0x1e0) = uVar57 * -2;
    *(uint *)((long)__s + 0x1e4) = -uVar57;
    *(uint *)((long)__s + 0x1e8) = uVar57;
    *(uint *)((long)__s + 0x1ec) = uVar57 * 2;
    *(undefined8 *)((long)__s + 0x1f0) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)__s + 0x1f8) = 0x7fffffff7fffffff;
    *(undefined4 *)((long)__s + 0x200) = 0x7fffffff;
    *(uint *)((long)__s + 0x1d8) = *(uint *)((long)__s + 0x1d8) & 0xfe000000 | 0x2083fe;
    *(uint *)((long)__s + 0x1dc) = *(uint *)((long)__s + 0x1dc) & 0xfff00000;
    if (*(int *)(lVar30 + 0x94) == 4) {
      *(uint *)((long)__s + 0x134) = uVar27 & 0xffff | uVar38 | uVar31;
    }
  }
  uVar28 = (uint)*(byte *)(lVar30 + 0x3b0);
  if (*(byte *)(lVar30 + 0x3b0) == 0) {
    uVar28 = (pEVar13->info).quality_min;
  }
  uVar27 = *(uint *)((long)__s + 0x208);
  uVar28 = uVar28 & 0x3f;
  *(uint *)((long)__s + 0x208) = uVar27 & 0xffffffc0 | uVar28;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3a8);
  if (*(byte *)(lVar30 + 0x3a8) == 0) {
    uVar26 = (pEVar13->info).quality_max;
  }
  uVar57 = (uVar26 & 0x3f) << 6;
  *(uint *)((long)__s + 0x208) = uVar27 & 0xfffff000 | uVar28 | uVar57;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3b1);
  if (*(byte *)(lVar30 + 0x3b1) == 0) {
    uVar26 = (pEVar13->info).quality_min;
  }
  uVar38 = (uVar26 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x208) = uVar27 & 0xfffc0000 | uVar28 | uVar57 | uVar38;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3a9);
  if (*(byte *)(lVar30 + 0x3a9) == 0) {
    uVar26 = (pEVar13->info).quality_max;
  }
  uVar31 = (uVar26 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x208) = uVar27 & 0xff000000 | uVar28 | uVar57 | uVar38 | uVar31;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3b2);
  if (*(byte *)(lVar30 + 0x3b2) == 0) {
    uVar26 = (pEVar13->info).quality_min;
  }
  *(uint *)((long)__s + 0x208) =
       uVar27 & 0xc0000000 | uVar28 | uVar57 | uVar38 | uVar31 | (uVar26 & 0x3f) << 0x18;
  uVar28 = (uint)*(byte *)(lVar30 + 0x3aa);
  if (*(byte *)(lVar30 + 0x3aa) == 0) {
    uVar28 = (pEVar13->info).quality_max;
  }
  uVar27 = *(uint *)((long)__s + 0x20c);
  uVar28 = uVar28 & 0x3f;
  *(uint *)((long)__s + 0x20c) = uVar27 & 0xffffffc0 | uVar28;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3b3);
  if (*(byte *)(lVar30 + 0x3b3) == 0) {
    uVar26 = (pEVar13->info).quality_min;
  }
  uVar57 = (uVar26 & 0x3f) << 6;
  *(uint *)((long)__s + 0x20c) = uVar27 & 0xfffff000 | uVar28 | uVar57;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3ab);
  if (*(byte *)(lVar30 + 0x3ab) == 0) {
    uVar26 = (pEVar13->info).quality_max;
  }
  uVar38 = (uVar26 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x20c) = uVar27 & 0xfffc0000 | uVar28 | uVar57 | uVar38;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3b4);
  if (*(byte *)(lVar30 + 0x3b4) == 0) {
    uVar26 = (pEVar13->info).quality_min;
  }
  uVar31 = (uVar26 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x20c) = uVar27 & 0xff000000 | uVar28 | uVar57 | uVar38 | uVar31;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3ac);
  if (*(byte *)(lVar30 + 0x3ac) == 0) {
    uVar26 = (pEVar13->info).quality_max;
  }
  *(uint *)((long)__s + 0x20c) =
       uVar27 & 0xc0000000 | uVar28 | uVar57 | uVar38 | uVar31 | (uVar26 & 0x3f) << 0x18;
  uVar28 = (uint)*(byte *)(lVar30 + 0x3b5);
  if (*(byte *)(lVar30 + 0x3b5) == 0) {
    uVar28 = (pEVar13->info).quality_min;
  }
  uVar27 = *(uint *)((long)__s + 0x210);
  uVar28 = uVar28 & 0x3f;
  *(uint *)((long)__s + 0x210) = uVar27 & 0xffffffc0 | uVar28;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3ad);
  if (*(byte *)(lVar30 + 0x3ad) == 0) {
    uVar26 = (pEVar13->info).quality_max;
  }
  uVar57 = (uVar26 & 0x3f) << 6;
  *(uint *)((long)__s + 0x210) = uVar27 & 0xfffff000 | uVar28 | uVar57;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3b6);
  if (*(byte *)(lVar30 + 0x3b6) == 0) {
    uVar26 = (pEVar13->info).quality_min;
  }
  uVar38 = (uVar26 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x210) = uVar27 & 0xfffc0000 | uVar28 | uVar57 | uVar38;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3ae);
  if (*(byte *)(lVar30 + 0x3ae) == 0) {
    uVar26 = (pEVar13->info).quality_max;
  }
  uVar31 = (uVar26 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x210) = uVar27 & 0xff000000 | uVar28 | uVar57 | uVar38 | uVar31;
  uVar26 = (uint)*(byte *)(lVar30 + 0x3b7);
  if (*(byte *)(lVar30 + 0x3b7) == 0) {
    uVar26 = (pEVar13->info).quality_min;
  }
  *(uint *)((long)__s + 0x210) =
       uVar27 & 0xc0000000 | uVar28 | uVar57 | uVar38 | uVar31 | (uVar26 & 0x3f) << 0x18;
  uVar28 = (uint)*(byte *)(lVar30 + 0x3af);
  if (*(byte *)(lVar30 + 0x3af) == 0) {
    uVar28 = (pEVar13->info).quality_max;
  }
  uVar27 = *(uint *)((long)__s + 0x194);
  uVar26 = *(uint *)((long)__s + 0x214);
  *(uint *)((long)__s + 0x214) = uVar26 & 0xffffffc0 | uVar28 & 0x3f;
  *(uint *)((long)__s + 0x214) =
       uVar26 & 0x3fffffc0 | uVar28 & 0x3f | *(int *)(lVar30 + 0x3b8) << 0x1e;
  uVar28 = *(uint *)(lVar9 + 0x24) >> 2 & 1;
  *(uint *)((long)__s + 0x194) = uVar27 & 0xfffffffe | uVar28;
  uVar26 = (uint)(byte)(*(char *)(lVar9 + 0x1d) * '\x02');
  *(uint *)((long)__s + 0x194) = uVar27 & 0xffffff00 | uVar28 | uVar26;
  uVar57 = (*(byte *)(lVar9 + 0x1e) & 0x3f) << 9;
  *(uint *)((long)__s + 0x194) = uVar27 & 0xffff8100 | uVar28 | uVar26 | uVar57;
  uVar38 = *(uint *)(lVar9 + 0x24) >> 9 & 0x100;
  *(uint *)((long)__s + 0x194) = uVar27 & 0xffff8000 | uVar28 | uVar26 | uVar57 | uVar38;
  uVar31 = *(uint *)(lVar9 + 0x24) >> 3 & 0x8000;
  *(uint *)((long)__s + 0x194) = uVar27 & 0xffff0000 | uVar28 | uVar26 | uVar57 | uVar38 | uVar31;
  uVar39 = (*(uint *)(lVar9 + 0x14) & 0x1e00) << 7;
  *(uint *)((long)__s + 0x194) =
       uVar27 & 0xfff00000 | uVar28 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39;
  *(uint *)((long)__s + 0x194) =
       (uVar27 & 0xffe00000 | uVar28 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39) +
       (*(uint *)(lVar9 + 0x24) & 0x80000) * 2;
  uVar27 = *(uint *)(lVar9 + 0x24) >> 0x14 & 1;
  uVar28 = *(uint *)((long)__s + 0x198);
  *(uint *)((long)__s + 0x198) = uVar28 & 0xfffffffe | uVar27;
  uVar26 = *(uint *)(lVar9 + 0x24) >> 0x14 & 2;
  *(uint *)((long)__s + 0x198) = uVar28 & 0xfffffffc | uVar27 | uVar26;
  uVar57 = *(uint *)(lVar9 + 0x24) >> 0x14 & 0x1c;
  *(uint *)((long)__s + 0x198) = uVar28 & 0xffffffe0 | uVar27 | uVar26 | uVar57;
  uVar38 = *(uint *)(lVar9 + 0x24) >> 0x14 & 0x20;
  *(uint *)((long)__s + 0x198) = uVar28 & 0xffffffc0 | uVar27 | uVar26 | uVar57 | uVar38;
  uVar31 = *(uint *)(lVar9 + 0x24) >> 0x14 & 0x40;
  *(uint *)((long)__s + 0x198) = uVar28 & 0xffffff80 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31;
  uVar39 = (uint)(*(char *)(lVar9 + 0x21) + 0x1aU & 0x3f) << 7;
  *(uint *)((long)__s + 0x198) =
       uVar28 & 0xffffe000 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39;
  uVar32 = (*(uint *)(lVar9 + 0x28) & 4) << 0xb;
  *(uint *)((long)__s + 0x198) =
       uVar28 & 0xffffc000 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39 | uVar32;
  uVar48 = (*(uint *)(lVar9 + 0x28) & 8) << 0xb;
  *(uint *)((long)__s + 0x198) =
       uVar28 & 0xffff8000 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39 | uVar32 | uVar48;
  uVar49 = (*(uint *)(lVar9 + 0x28) & 0x800) << 4;
  *(uint *)((long)__s + 0x198) =
       uVar28 & 0xffff0000 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39 | uVar32 | uVar48 |
       uVar49;
  uVar46 = (*(uint *)(lVar9 + 0x28) & 0x1000) << 4;
  *(uint *)((long)__s + 0x198) =
       uVar28 & 0xfffe0000 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39 | uVar32 | uVar48 |
       uVar49 | uVar46;
  uVar28 = (uVar28 & 0xfffc0000 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39 | uVar32 |
            uVar48 | uVar49 | uVar46) + (*(uint *)(lVar9 + 0x28) & 0x4000) * 8;
  *(uint *)((long)__s + 0x198) = uVar28;
  uVar28 = (uVar28 & 0xfffbffff) + (*(uint *)(lVar9 + 0x28) & 0x8000) * 8;
  *(uint *)((long)__s + 0x198) = uVar28;
  uVar27 = (*(byte *)(lVar9 + 0xd0) & 3) << 0x13;
  *(uint *)((long)__s + 0x198) = uVar28 & 0xffe7ffff | uVar27;
  *(uint *)((long)__s + 0x198) =
       uVar28 & 0xffc7ffff | uVar27 | (*(uint *)(lVar9 + 0x28) & 0x400) << 0xb;
  uVar27 = *(uint *)(lVar9 + 0xe4) >> 4 & 1;
  uVar28 = *(uint *)((long)__s + 0x19c);
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xfffffffe | uVar27;
  uVar26 = *(uint *)(lVar9 + 0xe4) >> 4 & 2;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xfffffffc | uVar27 | uVar26;
  uVar57 = *(uint *)(lVar9 + 0xe4) >> 4 & 4;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xfffffff8 | uVar27 | uVar26 | uVar57;
  uVar38 = *(uint *)(lVar9 + 0xe4) >> 4 & 8;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xfffffff0 | uVar27 | uVar26 | uVar57 | uVar38;
  uVar31 = *(uint *)(lVar9 + 0xe4) >> 3 & 0x20;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xffffffd0 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31;
  uVar39 = (uint)(byte)(*(char *)(lVar9 + 0xf0) << 6);
  *(uint *)((long)__s + 0x19c) =
       uVar28 & 0xffffff10 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39;
  uVar32 = (*(byte *)(lVar9 + 0xf1) & 3) << 8;
  *(uint *)((long)__s + 0x19c) =
       uVar28 & 0xfffffc10 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39 | uVar32;
  uVar28 = (uVar28 & 0xfffff810 | uVar27 | uVar26 | uVar57 | uVar38 | uVar31 | uVar39 | uVar32) +
           (*(uint *)(lVar9 + 0xe4) & 0x200) * 2;
  *(uint *)((long)__s + 0x19c) = uVar28;
  uVar28 = (uVar28 & 0xfffff7ff) + (*(uint *)(lVar9 + 0xe4) & 0x400) * 2;
  *(uint *)((long)__s + 0x19c) = uVar28;
  uVar28 = (uVar28 & 0xffffefff) + (*(uint *)(lVar9 + 0xe4) & 0x800) * 2;
  *(uint *)((long)__s + 0x19c) = uVar28;
  uVar28 = (uVar28 & 0xffffdfff) + (*(uint *)(lVar9 + 0xe4) & 0x1000) * 2;
  *(uint *)((long)__s + 0x19c) = uVar28;
  *(uint *)((long)__s + 0xe0) =
       *(uint *)((long)__s + 0xe0) & 0xfff83fff | (*(uint *)(lVar9 + 0x11c) & 0x1f) << 0xe;
  uVar28 = (uVar28 & 0xffffbfff) + (*(uint *)(lVar9 + 0xe4) & 0x2000) * 2;
  *(uint *)((long)__s + 0x19c) = uVar28;
  uVar38 = (*(byte *)(lVar9 + 0xf2) & 3) << 0xf;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xfffe7fff | uVar38;
  uVar31 = (*(byte *)(lVar9 + 0xf3) & 0x7f) << 0x11;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xff007fff | uVar38 | uVar31;
  uVar39 = (*(uint *)(lVar9 + 0xe4) & 0x4000) << 10;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xfe007fff | uVar38 | uVar31 | uVar39;
  uVar32 = (*(byte *)(lVar9 + 0xf4) & 0x3f) << 0x19;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0x80007fff | uVar38 | uVar31 | uVar39 | uVar32;
  uVar46 = (*(uint *)(lVar9 + 0xe4) & 0x8000) << 0x10;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0x7fff | uVar38 | uVar31 | uVar39 | uVar32 | uVar46;
  uVar27 = *(uint *)((long)__s + 0x1a0);
  uVar48 = *(byte *)(lVar9 + 0xea) & 0xf;
  *(uint *)((long)__s + 0x1a0) = uVar27 & 0xfffffff0 | uVar48;
  uVar49 = (uint)(byte)(*(char *)(lVar9 + 0xeb) << 4);
  *(uint *)((long)__s + 0x1a0) = uVar27 & 0xffffff00 | uVar48 | uVar49;
  uVar51 = *(uint *)(lVar9 + 0xe4) >> 8 & 0x100;
  *(uint *)((long)__s + 0x1a0) = uVar27 & 0xfffffe00 | uVar48 | uVar49 | uVar51;
  uVar26 = *(uint *)(lVar9 + 0xe4) >> 8 & 0x200;
  *(uint *)((long)__s + 0x1a0) = uVar27 & 0xfffffc00 | uVar48 | uVar49 | uVar51 | uVar26;
  uVar57 = *(uint *)(lVar9 + 0xe4) >> 8 & 0x400;
  *(uint *)((long)__s + 0x1a0) = uVar27 & 0xfffff800 | uVar48 | uVar49 | uVar51 | uVar26 | uVar57;
  pbVar22 = (byte *)(lVar9 + 0xec);
  if ((*(byte *)(lVar9 + 0x28) & 8) == 0) {
    pbVar22 = (byte *)(lVar9 + 0x2c);
  }
  uVar19 = (*pbVar22 & 0x1f) << 0xb;
  *(uint *)((long)__s + 0x1a0) =
       uVar27 & 0xffff0000 | uVar48 | uVar49 | uVar51 | uVar26 | uVar57 | uVar19;
  uVar20 = (*(byte *)(lVar9 + 0xee) & 3) << 0x16;
  *(uint *)((long)__s + 0x1a0) =
       uVar27 & 0xff3f0000 | uVar48 | uVar49 | uVar51 | uVar26 | uVar57 | uVar19 | uVar20;
  uVar29 = (*(uint *)(lVar9 + 0xe4) & 0x80000) << 6;
  *(uint *)((long)__s + 0x1a0) =
       uVar27 & 0xfd3f0000 | uVar48 | uVar49 | uVar51 | uVar26 | uVar57 | uVar19 | uVar20 | uVar29;
  uVar52 = (*(uint *)(lVar9 + 0xe4) & 0x100000) << 6;
  *(uint *)((long)__s + 0x1a0) =
       uVar27 & 0xf93f0000 | uVar48 | uVar49 | uVar51 | uVar26 | uVar57 | uVar19 | uVar20 | uVar29 |
       uVar52;
  uVar36 = CONCAT22(*(undefined2 *)((long)__s + 0x1a6),*(undefined2 *)(lVar9 + 0xfc));
  *(uint *)((long)__s + 0x1a4) = uVar36;
  *(uint *)((long)__s + 0x1a4) = uVar36 & 0xfe00ffff | (*(ushort *)(lVar9 + 0xfe) & 0x1ff) << 0x10;
  uVar53 = *(uint *)(lVar9 + 0xe4) >> 0x15 & 1;
  uVar36 = *(uint *)((long)__s + 0x1a8);
  *(uint *)((long)__s + 0x1a8) = uVar36 & 0xfffffffe | uVar53;
  uVar36 = (uVar36 & 0xfffe0000 | uVar53) + (uint)*(ushort *)(lVar9 + 0x100) * 2;
  *(uint *)((long)__s + 0x1a8) = uVar36;
  *(uint *)((long)__s + 0x1a8) = uVar36 & 0xff3fffff | (*(byte *)(lVar9 + 0xf6) & 3) << 0x16;
  uVar36 = (*(uint *)((long)__s + 0x1ac) & 0xfbffffff) + (*(uint *)(lVar9 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar53 = (uint)*(ushort *)(lVar9 + 0x106) << 10;
  *(uint *)((long)__s + 0x1ac) = uVar36 & 0xfc0003ff | uVar53;
  uVar36 = (uVar36 & 0xdc0003ff | uVar53) + (*(uint *)(lVar9 + 0xe4) & 0x4000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar36 = (uVar36 & 0xbfffffff) + (*(uint *)(lVar9 + 0xe4) & 0x8000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar36 = (uVar36 & 0x7fffffff) + (*(uint *)(lVar9 + 0xe4) & 0xf0000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar36 = (uVar36 & 0xfbffffff) + (*(uint *)(lVar9 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar53 = (uint)*(ushort *)(lVar9 + 0x106) << 10;
  *(uint *)((long)__s + 0x1ac) = uVar36 & 0xfc0003ff | uVar53;
  uVar36 = (uVar36 & 0xf40003ff | uVar53) + (*(uint *)(lVar9 + 0xe4) & 0x1000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar53 = (*(byte *)(lVar9 + 0xfa) & 0x1f) << 5;
  *(uint *)((long)__s + 0x1ac) = uVar36 & 0xfffffc1f | uVar53;
  uVar41 = *(uint *)(lVar9 + 0xe4) >> 0x12 & 0x10;
  *(uint *)((long)__s + 0x1ac) = uVar36 & 0xfffffc0f | uVar53 | uVar41;
  uVar42 = *(byte *)(lVar9 + 0xf9) & 0xf;
  *(uint *)((long)__s + 0x1ac) = uVar36 & 0xfffffc00 | uVar53 | uVar41 | uVar42;
  uVar4 = *(undefined2 *)(lVar9 + 0x108);
  *(undefined2 *)((long)__s + 0x1b0) = uVar4;
  *(uint *)((long)__s + 0x1b0) = CONCAT22(*(undefined2 *)(lVar9 + 0x10a),uVar4);
  uVar4 = *(undefined2 *)(lVar9 + 0x10c);
  *(undefined2 *)((long)__s + 0x1b4) = uVar4;
  *(uint *)((long)__s + 0x1b4) = CONCAT22(*(undefined2 *)(lVar9 + 0x10e),uVar4);
  uVar4 = *(undefined2 *)(lVar9 + 0x110);
  *(undefined2 *)((long)__s + 0x1b8) = uVar4;
  uVar5 = *(undefined2 *)(lVar9 + 0x114);
  *(undefined2 *)((long)__s + 0x1bc) = uVar5;
  *(uint *)((long)__s + 0x1b8) = CONCAT22(*(undefined2 *)(lVar9 + 0x112),uVar4);
  *(uint *)((long)__s + 0x1ac) =
       (uVar36 & 0xeffffc00 | uVar53 | uVar41 | uVar42) + (*(uint *)(lVar9 + 0xe4) & 0x2000000) * 8;
  *(uint *)((long)__s + 0x1bc) = CONCAT22(*(undefined2 *)(lVar9 + 0x116),uVar5);
  *(uint *)((long)__s + 0x1a0) =
       uVar27 & 0x813f0000 | uVar48 | uVar49 | uVar51 | uVar26 | uVar57 | uVar19 | uVar20 | uVar29 |
       uVar52 | (*(byte *)(lVar9 + 0xef) & 0xf) << 0x1b;
  *(uint *)((long)__s + 0x19c) =
       uVar28 & 0x7fdf | uVar38 | uVar31 | uVar39 | uVar32 | uVar46 |
       *(uint *)(lVar9 + 0xe4) >> 3 & 0x20;
  vepu580_set_osd((Vepu541OsdCfg *)(*(long *)((long)hal + 0x80) + 0x1c8));
  puVar55 = *(undefined8 **)(*(long *)((long)hal + 0x80) + 0x1f8);
  if (puVar55 != (undefined8 *)0x0) {
    iVar37 = (*(int *)(*(long *)((long)hal + 200) + 0x10) + 0x3f >> 6) *
             (*(int *)(*(long *)((long)hal + 200) + 0xc) + 0x3f >> 6);
    sVar23 = mpp_buffer_get_size_with_caller((MppBuffer)*puVar55,"vepu580_h265_set_roi_regs");
    if (sVar23 < (uint)(iVar37 * 0x40)) {
      _mpp_log_l(2,"hal_h265e_v580","roi base cfg buf not enough, roi is invalid",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 2;
      iVar58 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar55,"vepu580_h265_set_roi_regs");
      *(int *)((long)__s + 0xa8) = iVar58;
    }
    if ((*(byte *)(puVar55 + 4) & 1) != 0) {
      sVar23 = mpp_buffer_get_size_with_caller((MppBuffer)puVar55[1],"vepu580_h265_set_roi_regs");
      if (sVar23 < (uint)(iVar37 * 0x100)) {
        _mpp_log_l(2,"hal_h265e_v580","roi qp cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar58 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar55[1],"vepu580_h265_set_roi_regs");
        *(int *)((long)__s + 0xac) = iVar58;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 1;
      }
    }
    if ((*(byte *)(puVar55 + 4) & 2) != 0) {
      sVar23 = mpp_buffer_get_size_with_caller((MppBuffer)puVar55[2],"vepu580_h265_set_roi_regs");
      if (sVar23 < (uint)(iVar37 * 0x200)) {
        _mpp_log_l(2,"hal_h265e_v580","roi amv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar58 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar55[2],"vepu580_h265_set_roi_regs");
        *(int *)((long)__s + 0xb0) = iVar58;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 2;
      }
    }
    if ((*(byte *)(puVar55 + 4) & 4) != 0) {
      sVar23 = mpp_buffer_get_size_with_caller((MppBuffer)puVar55[3],"vepu580_h265_set_roi_regs");
      if (sVar23 < (uint)(iVar37 * 4)) {
        _mpp_log_l(2,"hal_h265e_v580","roi mv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar37 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar55[3],"vepu580_h265_set_roi_regs");
        *(int *)((long)__s + 0xb4) = iVar37;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 4;
      }
    }
  }
  uVar44 = (pEVar8->frm).val;
  if ((uVar44 >> 0x26 & 1) != 0) {
    lVar30 = *(long *)((long)hal + 0x80);
    lVar25 = *(long *)((long)hal + 200);
    uVar44 = (long)(uVar44 >> 0x30) % (long)*(int *)(lVar25 + 0xc4);
    uVar33 = uVar44 & 0xffffffff;
    lVar14 = *(long *)(lVar30 + 0x18);
    puVar55 = *(undefined8 **)(lVar30 + 0x1f8);
    iVar37 = *(int *)(lVar25 + 0xc);
    iVar58 = *(int *)(lVar25 + 0x10);
    if ((hal_h265e_debug & 1) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","enter\n","setup_intra_refresh");
      lVar25 = *(long *)((long)hal + 200);
    }
    if (*(int *)(lVar25 + 0x164) == 0) {
      uVar28 = 0xfffffffa;
    }
    else {
      uVar26 = iVar37 + 0x3f;
      uVar27 = iVar58 + 0x3f;
      uVar57 = uVar27 >> 6;
      uVar28 = (uVar26 & 0xffffffc0) * uVar57;
      size = (ulong)uVar28;
      if (*(long *)(lVar30 + 0x1f8) == 0) {
        if (*(int *)(lVar30 + 0x210) < (int)uVar28) {
          if (*(long *)((long)hal + 0xb8) == 0) {
            mpp_buffer_group_get
                      ((MppBufferGroup *)((long)hal + 0xb8),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                       "hal_h265e_v580","setup_intra_refresh");
          }
          if (*(MppBuffer *)(lVar30 + 0x200) != (MppBuffer)0x0) {
            mpp_buffer_put_with_caller(*(MppBuffer *)(lVar30 + 0x200),"setup_intra_refresh");
          }
          if (*(void **)(lVar30 + 0x208) != (void *)0x0) {
            mpp_osal_free("setup_intra_refresh",*(void **)(lVar30 + 0x208));
          }
          *(undefined8 *)(lVar30 + 0x208) = 0;
          pvVar24 = mpp_osal_malloc("setup_intra_refresh",size);
          *(void **)(lVar30 + 0x208) = pvVar24;
          mpp_buffer_get_with_tag
                    (*(MppBufferGroup *)((long)hal + 0xb8),(MppBuffer *)(lVar30 + 0x200),size,
                     "hal_h265e_v580","setup_intra_refresh");
        }
        puVar55 = (undefined8 *)(lVar30 + 0x200);
      }
      uVar38 = uVar26 >> 6;
      pvVar24 = mpp_buffer_get_ptr_with_caller((MppBuffer)*puVar55,"setup_intra_refresh");
      iVar37 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar55,"setup_intra_refresh");
      *(uint *)(lVar30 + 0x210) = uVar28;
      memset(*(void **)(lVar30 + 0x208),0,size);
      uVar28 = *(uint *)(*(long *)((long)hal + 200) + 0x16c);
      iVar58 = (int)uVar44;
      uVar44 = (ulong)(uVar28 * iVar58 - 1);
      if (iVar58 == 0) {
        uVar44 = uVar33;
      }
      uVar39 = (uint)uVar44;
      uVar31 = (uVar28 - (iVar58 == 0)) + uVar39;
      if (*(int *)(*(long *)((long)hal + 200) + 0x168) == 0) {
        uVar32 = uVar38 - 1;
        uVar39 = 0;
      }
      else {
        uVar44 = 0;
        uVar32 = uVar31;
        uVar31 = uVar57 - 1;
      }
      uVar46 = uVar38 - 1;
      if ((int)uVar32 < (int)uVar38) {
        uVar46 = uVar32;
      }
      uVar32 = uVar57 - 1;
      if ((int)uVar31 < (int)uVar57) {
        uVar32 = uVar31;
      }
      if ((hal_h265e_debug & 8) != 0) {
        uVar54 = 0;
        if (0 < (int)uVar39) {
          uVar54 = (ulong)uVar39;
        }
        uVar50 = 0;
        if (0 < (int)uVar44) {
          uVar50 = uVar44;
        }
        _mpp_log_l(4,"hal_h265e_v580",
                   "size in ctu : %d x %d, refresh_num %d, refresh_idx %d, area x[%d, %d], y[%d, %d]"
                   ,(char *)0x0,(ulong)uVar38,(ulong)uVar57,(ulong)uVar28,uVar33,uVar54,
                   (ulong)uVar46,uVar50,(ulong)uVar32);
      }
      __src = *(void **)(lVar30 + 0x208);
      if (0x3f < uVar27) {
        uVar28 = 0;
        do {
          if (0x3f < uVar26) {
            uVar27 = 0;
            do {
              if (((int)uVar27 <= (int)uVar46 &&
                   ((int)uVar44 <= (int)uVar28 && (int)uVar28 <= (int)uVar32)) &&
                 ((int)uVar39 <= (int)uVar27)) {
                *(undefined8 *)((long)__src + 0x16) = 0x5555555555555555;
                *(undefined8 *)((long)__src + 0x1e) = 0x5555555555555555;
                *(undefined4 *)((long)__src + 0x26) = 0x55555555;
                *(undefined1 *)((long)__src + 0x15) = 0x54;
                *(undefined1 *)((long)__src + 0x2a) = 5;
              }
              __src = (void *)((long)__src + 0x40);
              uVar27 = uVar27 + 1;
            } while (uVar38 != uVar27);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar57);
        __src = *(void **)(lVar30 + 0x208);
      }
      memcpy(pvVar24,__src,size);
      iVar58 = *(int *)(*(long *)((long)hal + 200) + 0x168);
      if (iVar58 == 0) {
        uVar28 = 0x10;
        uVar27 = 0xffffff0f;
LAB_00251847:
        *(uint *)(lVar14 + 0x150) = uVar27 & *(uint *)(lVar14 + 0x150) | uVar28;
      }
      else if (iVar58 == 1) {
        uVar28 = 1;
        uVar27 = 0xfffffff0;
        goto LAB_00251847;
      }
      *(byte *)(lVar14 + 0xe0) = *(byte *)(lVar14 + 0xe0) | 2;
      *(int *)(lVar14 + 0xa8) = iVar37;
      uVar28 = 0;
      mpp_buffer_sync_end_f(*(MppBuffer *)(lVar30 + 0x200),0,"setup_intra_refresh");
    }
    if ((hal_h265e_debug & 1) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","leave, ret %d\n","setup_intra_refresh",(ulong)uVar28);
    }
  }
  if (((*(int *)(lVar11 + 0x1868) == 0) || ((pEVar8->info).complex_scene != 0)) ||
     ((*(int *)(lVar11 + 0x94) != 4 ||
      ((task->md_info == (MppBuffer)0x0 || (*(int *)(lVar11 + 0x1864) != 1)))))) goto LAB_00251aa0;
  lVar30 = *(long *)((long)hal + 200);
  iVar37 = (*(int *)(lVar30 + 0x10) + 0x3f >> 6) * (*(int *)(lVar30 + 0xc) + 0x3f >> 6);
  *(int *)((long)hal + 0x17c) = iVar37 * 0x40;
  *(int *)((long)hal + 0x180) = iVar37 * 0xc0;
  *(int *)((long)hal + 0x184) = iVar37 * 0x10;
  if (*(int *)(lVar30 + 0x1868) == 0) {
    uVar56 = 0;
    _mpp_log_l(4,"hal_h265e_v580","deblurring is closed!\n",(char *)0x0);
    bVar59 = true;
    goto LAB_00251a4f;
  }
  if ((*(long *)((long)hal + 0x160) == 0) &&
     (mpp_buffer_get_with_tag
                ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x160),(long)(iVar37 * 0x40),
                 "hal_h265e_v580","vepu580_setup_qpmap_buf"),
     *(MppBuffer *)((long)hal + 0x160) == (MppBuffer)0x0)) {
    fmt = "qpmap_base_cfg_buf malloc fail, qpmap invalid\n";
LAB_00251a38:
    bVar59 = false;
    _mpp_log_l(2,"hal_h265e_v580",fmt,(char *)0x0);
    uVar56 = 0xfffffffa;
  }
  else {
    if ((*(long *)((long)hal + 0x168) == 0) &&
       (mpp_buffer_get_with_tag
                  ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x168),(long)(iVar37 * 0xc0),
                   "hal_h265e_v580","vepu580_setup_qpmap_buf"),
       *(MppBuffer *)((long)hal + 0x168) == (MppBuffer)0x0)) {
      fmt = "qpmap_qp_cfg_buf malloc fail, qpmap invalid\n";
      goto LAB_00251a38;
    }
    bVar59 = true;
    if (*(long *)((long)hal + 0x170) == 0) {
      pvVar24 = mpp_osal_malloc("vepu580_setup_qpmap_buf",(long)(iVar37 * 0x10));
      *(void **)((long)hal + 0x170) = pvVar24;
      uVar56 = 0;
      if (pvVar24 == (void *)0x0) {
        fmt = "md_flag_buf malloc fail, qpmap invalid\n";
        goto LAB_00251a38;
      }
    }
    else {
      uVar56 = 0;
    }
  }
LAB_00251a4f:
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","leave, ret %d\n","vepu580_setup_qpmap_buf",uVar56);
  }
  if (!bVar59) {
    _mpp_log_l(2,"hal_h265e_v580","qpmap malloc buffer failed!\n",(char *)0x0);
  }
LAB_00251aa0:
  lVar30 = *(long *)((long)hal + 200);
  *(uint *)((long)__s + 0x6bc) = *(uint *)((long)__s + 0x6bc) & 0xc0000000 | 0xe34c2ca;
  *(uint *)((long)__s + 0x6c0) = *(uint *)((long)__s + 0x6c0) & 0xc0000000 | 0x74083c9;
  *(uint *)((long)__s + 0x6c4) = *(uint *)((long)__s + 0x6c4) & 0xc0000000 | 0x61c824a;
  *(uint *)((long)__s + 0x6c8) = *(uint *)((long)__s + 0x6c8) & 0xc0000000 | 0xd10c14b;
  *(uint *)((long)__s + 0x6cc) = *(uint *)((long)__s + 0x6cc) & 0xc0000000 | 0xe3d0452;
  *(uint *)((long)__s + 0x6d0) = *(uint *)((long)__s + 0x6d0) & 0xc0000000 | 0x15314353;
  *(uint *)((long)__s + 0x6d4) = *(uint *)((long)__s + 0x6d4) & 0xc0000000 | 0x165544d2;
  *(uint *)((long)__s + 0x6d8) = *(uint *)((long)__s + 0x6d8) & 0xc0000000 | 0xf6105d1;
  *(uint *)((long)__s + 0x6dc) = *(uint *)((long)__s + 0x6dc) & 0xc0000000 | 0x165d8699;
  *(uint *)((long)__s + 0x6e0) = *(uint *)((long)__s + 0x6e0) & 0xc0000000 | 0x1d51c55b;
  *(uint *)((long)__s + 0x6e4) = *(uint *)((long)__s + 0x6e4) & 0xc0000000 | 0x1e75c69b;
  *(uint *)((long)__s + 0x6e8) = *(uint *)((long)__s + 0x6e8) & 0xc0000000 | 0x178187d9;
  *(uint *)((long)__s + 0x6ec) = *(uint *)((long)__s + 0x6ec) & 0xc0000000 | 0x1e7e0862;
  *(uint *)((long)__s + 0x6f0) = *(uint *)((long)__s + 0x6f0) & 0xc0000000 | 0x4703742;
  *(uint *)((long)__s + 0x6f4) = *(uint *)((long)__s + 0x6f4) & 0xc0000000 | 0x51030a2;
  *(uint *)((long)__s + 0x6f8) = *(uint *)((long)__s + 0x6f8) & 0xc0000000 | 0x1f1e01a1;
  *(ulong *)((long)__s + 0x6fc) =
       *(ulong *)((long)__s + 0x6fc) & 0xc0000000c0000000 | (ulong)DAT_002b8c10;
  *(uint *)((long)__s + 0x704) = *(uint *)((long)__s + 0x704) & 0xc0000000;
  *(uint *)((long)__s + 0x708) = *(uint *)((long)__s + 0x708) & 0xc0000000;
  *(uint *)((long)__s + 0x70c) = *(uint *)((long)__s + 0x70c) & 0xc0000000;
  *(uint *)((long)__s + 0x710) = *(uint *)((long)__s + 0x710) & 0xc0000000;
  *(uint *)((long)__s + 0x714) = *(uint *)((long)__s + 0x714) & 0xc0000000;
  *(uint *)((long)__s + 0x718) = *(uint *)((long)__s + 0x718) & 0xc0000000;
  *(uint *)((long)__s + 0x71c) = *(uint *)((long)__s + 0x71c) & 0xc0000000;
  *(uint *)((long)__s + 0x720) = *(uint *)((long)__s + 0x720) & 0xc0000000;
  *(uint *)((long)__s + 0x724) = *(uint *)((long)__s + 0x724) & 0xc0000000;
  *(uint *)((long)__s + 0x728) = *(uint *)((long)__s + 0x728) & 0xc0000000;
  *(uint *)((long)__s + 0x72c) = *(uint *)((long)__s + 0x72c) & 0xc0000000;
  *(uint *)((long)__s + 0x730) = *(uint *)((long)__s + 0x730) & 0xc0000000;
  *(uint *)((long)__s + 0x734) = *(uint *)((long)__s + 0x734) & 0xc0000000;
  *(uint *)((long)__s + 0x738) = *(uint *)((long)__s + 0x738) & 0xc0000000;
  *(uint *)((long)__s + 0x73c) = *(uint *)((long)__s + 0x73c) & 0xc0000000;
  *(uint *)((long)__s + 0x740) = *(uint *)((long)__s + 0x740) & 0xc0000000;
  *(ulong *)((long)__s + 0x7bc) =
       *(ulong *)((long)__s + 0x7bc) & 0xc0000000f000f000 | (ulong)DAT_002b8c30;
  *(uint *)((long)__s + 0x7c4) = (uint)*(byte *)((long)__s + 0x7c7) << 0x18 | 0x820820;
  *(uint *)((long)__s + 0x7c8) = *(uint *)((long)__s + 0x7c8) & 0x80008000;
  *(uint *)((long)__s + 0x7cc) = *(uint *)((long)__s + 0x7cc) & 0x80008000;
  *(uint *)((long)__s + 2000) = *(uint *)((long)__s + 2000) & 0x80008000;
  *(uint *)((long)__s + 0x7d4) = *(uint *)((long)__s + 0x7d4) & 0x80008000;
  *(uint *)((long)__s + 0x7d8) = *(uint *)((long)__s + 0x7d8) & 0xffff8000;
  *(uint *)((long)__s + 0x7dc) = *(uint *)((long)__s + 0x7dc) & 0xc0000000 | 0xd34d34d;
  *(uint *)((long)__s + 0x7e0) = *(uint *)((long)__s + 0x7e0) & 0xff000000 | 0x34d34d;
  *(uint *)((long)__s + 0x7e4) = *(uint *)((long)__s + 0x7e4) & 0x80008000 | 0x5cc65cc6;
  *(uint *)((long)__s + 0x7e8) = *(uint *)((long)__s + 0x7e8) & 0x80008000 | 0x5cc65cc6;
  *(ulong *)((long)__s + 0x7ec) =
       *(ulong *)((long)__s + 0x7ec) & 0x8000800080008000 | (ulong)DAT_002b8c80;
  *(uint *)((long)__s + 0x7f4) = *(uint *)((long)__s + 0x7f4) & 0xffff8000 | 0x5cc6;
  *(undefined4 *)((long)__s + 0x7f8) = 20000;
  *(undefined4 *)((long)__s + 0x800) = 20000;
  *(undefined4 *)((long)__s + 0x808) = 20000;
  *(undefined4 *)((long)__s + 0x810) = 20000;
  *(undefined4 *)((long)__s + 0x818) = 20000;
  *(undefined4 *)((long)__s + 0x820) = 20000;
  *(undefined4 *)((long)__s + 0x828) = 20000;
  *(undefined4 *)((long)__s + 0x830) = 20000;
  *(undefined4 *)((long)__s + 0x838) = 20000;
  *(byte *)((long)__s + 0x7fc) = *(byte *)((long)__s + 0x7fc) & 0xfc;
  *(byte *)((long)__s + 0x804) = *(byte *)((long)__s + 0x804) & 0xfc;
  *(byte *)((long)__s + 0x80c) = *(byte *)((long)__s + 0x80c) & 0xfc;
  *(byte *)((long)__s + 0x814) = *(byte *)((long)__s + 0x814) & 0xfc;
  *(byte *)((long)__s + 0x81c) = *(byte *)((long)__s + 0x81c) & 0xfc;
  *(byte *)((long)__s + 0x824) = *(byte *)((long)__s + 0x824) & 0xfc;
  *(byte *)((long)__s + 0x82c) = *(byte *)((long)__s + 0x82c) & 0xfc;
  *(byte *)((long)__s + 0x834) = *(byte *)((long)__s + 0x834) & 0xfc;
  *(byte *)((long)__s + 0x83c) = *(byte *)((long)__s + 0x83c) & 0xfc;
  *(uint *)((long)__s + 0x840) = *(uint *)((long)__s + 0x840) & 0xf000f000 | 0x1900040;
  *(uint *)((long)__s + 0x844) = *(uint *)((long)__s + 0x844) & 0xffffffc0 | 8;
  *(uint *)((long)__s + 0x848) = *(uint *)((long)__s + 0x848) & 0xf000f000 | 0x640064;
  *(uint *)((long)__s + 0x84c) = *(uint *)((long)__s + 0x84c) & 0xc0000000 | 0x12492492;
  *(ulong *)((long)__s + 0x850) = *(ulong *)((long)__s + 0x850) & 0x8000800080008000;
  *(uint *)((long)__s + 0x858) = *(uint *)((long)__s + 0x858) & 0xffff8000;
  *(uint *)((long)__s + 0x85c) = *(uint *)((long)__s + 0x85c) & 0xc0000000 | 0x10410410;
  *(ulong *)((long)__s + 0x860) = *(ulong *)((long)__s + 0x860) & 0x8000800080008000;
  *(uint *)((long)__s + 0x868) = *(uint *)((long)__s + 0x868) & 0xffff8000;
  *(undefined4 *)((long)__s + 0x86c) = 20000;
  *(undefined4 *)((long)__s + 0x874) = 20000;
  *(undefined4 *)((long)__s + 0x87c) = 20000;
  *(undefined4 *)((long)__s + 0x884) = 20000;
  *(undefined4 *)((long)__s + 0x88c) = 20000;
  *(uint *)((long)__s + 0x870) = *(uint *)((long)__s + 0x870) & 0xfffffe00;
  *(uint *)((long)__s + 0x878) = *(uint *)((long)__s + 0x878) & 0xfffffe00;
  *(uint *)((long)__s + 0x880) = *(uint *)((long)__s + 0x880) & 0xfffffe00;
  *(uint *)((long)__s + 0x888) = *(uint *)((long)__s + 0x888) & 0xfffffe00;
  *(uint *)((long)__s + 0x890) = *(uint *)((long)__s + 0x890) & 0xfffffe00;
  *(byte *)((long)__s + 0x894) = *(byte *)((long)__s + 0x894) | 3;
  *(uint *)((long)__s + 0x898) = *(uint *)((long)__s + 0x898) & 0xf000f000 | 0x900020;
  *(uint *)((long)__s + 0x89c) = *(uint *)((long)__s + 0x89c) & 0xfffff000 | 300;
  *(uint *)((long)__s + 0x8a0) = *(uint *)((long)__s + 0x8a0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8a4) = *(uint *)((long)__s + 0x8a4) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8a8) = *(uint *)((long)__s + 0x8a8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8ac) = *(uint *)((long)__s + 0x8ac) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8b0) = *(uint *)((long)__s + 0x8b0) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x8b4) = *(uint *)((long)__s + 0x8b4) & 0xff000000 | 0x101010;
  *(ulong *)((long)__s + 0x8b8) =
       *(ulong *)((long)__s + 0x8b8) & 0xff000000ff000000 | (ulong)DAT_002ad4c0;
  *(uint *)((long)__s + 0x8c0) = *(uint *)((long)__s + 0x8c0) & 0xf000f000 | 0x40018;
  *(uint *)((long)__s + 0x8c4) = *(uint *)((long)__s + 0x8c4) & 0xf000f000 | 0x80006;
  *(uint *)((long)__s + 0x8c8) = *(uint *)((long)__s + 0x8c8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8cc) = *(uint *)((long)__s + 0x8cc) & 0xf000f000 | 0x190001f;
  *(ulong *)((long)__s + 0x8d0) =
       *(ulong *)((long)__s + 0x8d0) & 0xf000f000f000f000 | (ulong)DAT_002b9190;
  *(undefined4 *)((long)__s + 0x8d8) = 0xa0a0a10;
  *(uint *)((long)__s + 0x8dc) = *(uint *)((long)__s + 0x8dc) & 0xff000000 | 0xf0e0e;
  *(uint *)((long)__s + 0x8e0) = *(uint *)((long)__s + 0x8e0) & 0xff000000 | 0x100f0f;
  *(uint *)((long)__s + 0x8e4) = *(uint *)((long)__s + 0x8e4) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x8e8) = *(uint *)((long)__s + 0x8e8) & 0xf000f000 | 0x300018;
  *(uint *)((long)__s + 0x8ec) = *(uint *)((long)__s + 0x8ec) & 0xfffff000 | 0x40;
  *(uint *)((long)__s + 0x8f0) = *(uint *)((long)__s + 0x8f0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8f4) = *(uint *)((long)__s + 0x8f4) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8f8) = *(uint *)((long)__s + 0x8f8) & 0xf000f000 | 0x190001f;
  *(ulong *)((long)__s + 0x8fc) =
       *(ulong *)((long)__s + 0x8fc) & 0xff000000f000f000 | 0x19191a0190001f;
  *(ulong *)((long)__s + 0x904) =
       *(ulong *)((long)__s + 0x904) & 0xff000000ff000000 | 0x12131500171819;
  *(ulong *)((long)__s + 0x90c) =
       *(ulong *)((long)__s + 0x90c) & 0xf000f000ff000000 | 0x90002000101010;
  *(ulong *)((long)__s + 0x914) =
       *(ulong *)((long)__s + 0x914) & 0xf000f000fffff000 | 0x190001f0000012c;
  *(ulong *)((long)__s + 0x91c) =
       *(ulong *)((long)__s + 0x91c) & 0xf000f000f000f000 | 0x190001f0190001f;
  *(ulong *)((long)__s + 0x924) =
       *(ulong *)((long)__s + 0x924) & 0xff000000f000f000 | 0x1010100190001f;
  *(uint *)((long)__s + 0x92c) = *(uint *)((long)__s + 0x92c) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x930) = *(uint *)((long)__s + 0x930) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x934) = *(uint *)((long)__s + 0x934) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x938) = *(uint *)((long)__s + 0x938) & 0xf000f000 | 0x40018;
  *(uint *)((long)__s + 0x93c) = *(uint *)((long)__s + 0x93c) & 0xf000f000 | 0x80006;
  *(uint *)((long)__s + 0x940) = *(uint *)((long)__s + 0x940) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x944) = *(uint *)((long)__s + 0x944) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x948) = *(uint *)((long)__s + 0x948) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x94c) = *(uint *)((long)__s + 0x94c) & 0xf000f000 | 0x190001f;
  *(undefined4 *)((long)__s + 0x950) = 0xb0b0b12;
  *(uint *)((long)__s + 0x954) = *(uint *)((long)__s + 0x954) & 0xff000000 | 0xd0d0d;
  *(uint *)((long)__s + 0x958) = *(uint *)((long)__s + 0x958) & 0xff000000 | 0xf0f0f;
  *(uint *)((long)__s + 0x95c) = *(uint *)((long)__s + 0x95c) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x960) = *(uint *)((long)__s + 0x960) & 0xf000f000 | 0x300018;
  *(uint *)((long)__s + 0x964) = *(uint *)((long)__s + 0x964) & 0xfffff000 | 0x40;
  *(uint *)((long)__s + 0x968) = *(uint *)((long)__s + 0x968) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x96c) = *(uint *)((long)__s + 0x96c) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x970) = *(uint *)((long)__s + 0x970) & 0xf000f000 | 0x190001f;
  *(ulong *)((long)__s + 0x974) =
       *(ulong *)((long)__s + 0x974) & 0xff000000f000f000 | 0x19191a0190001f;
  *(ulong *)((long)__s + 0x97c) =
       *(ulong *)((long)__s + 0x97c) & 0xff000000ff000000 | 0x12131500171819;
  *(ulong *)((long)__s + 0x984) =
       *(ulong *)((long)__s + 0x984) & 0xf000f000ff000000 | 0x90002000101010;
  *(ulong *)((long)__s + 0x98c) =
       *(ulong *)((long)__s + 0x98c) & 0xf000f000fffff000 | 0x190001f0000012c;
  *(ulong *)((long)__s + 0x994) =
       *(ulong *)((long)__s + 0x994) & 0xf000f000f000f000 | 0x190001f0190001f;
  *(ulong *)((long)__s + 0x99c) =
       *(ulong *)((long)__s + 0x99c) & 0xff000000f000f000 | 0x1010100190001f;
  *(uint *)((long)__s + 0x9a4) = *(uint *)((long)__s + 0x9a4) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9a8) = *(uint *)((long)__s + 0x9a8) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9ac) = *(uint *)((long)__s + 0x9ac) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9b0) = *(uint *)((long)__s + 0x9b0) & 0xf000f000 | 0x180018;
  *(uint *)((long)__s + 0x9b4) = *(uint *)((long)__s + 0x9b4) & 0xf000f000 | 0x600030;
  *(uint *)((long)__s + 0x9b8) = *(uint *)((long)__s + 0x9b8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9bc) = *(uint *)((long)__s + 0x9bc) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9c0) = *(uint *)((long)__s + 0x9c0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9c4) = *(uint *)((long)__s + 0x9c4) & 0xf000f000 | 0x190001f;
  *(undefined4 *)((long)__s + 0x9c8) = 0x10101010;
  *(uint *)((long)__s + 0x9cc) = *(uint *)((long)__s + 0x9cc) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9d0) = *(uint *)((long)__s + 0x9d0) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9d4) = *(uint *)((long)__s + 0x9d4) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0x9d8) = *(uint *)((long)__s + 0x9d8) & 0xf000f000 | 0x300018;
  *(uint *)((long)__s + 0x9dc) = *(uint *)((long)__s + 0x9dc) & 0xfffff000 | 0x40;
  *(uint *)((long)__s + 0x9e0) = *(uint *)((long)__s + 0x9e0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9e4) = *(uint *)((long)__s + 0x9e4) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9e8) = *(uint *)((long)__s + 0x9e8) & 0xf000f000 | 0x190001f;
  *(ulong *)((long)__s + 0x9ec) =
       *(ulong *)((long)__s + 0x9ec) & 0xff000000f000f000 | 0x19191a0190001f;
  *(ulong *)((long)__s + 0x9f4) =
       *(ulong *)((long)__s + 0x9f4) & 0xff000000ff000000 | 0x12131500171819;
  *(ulong *)((long)__s + 0x9fc) =
       *(ulong *)((long)__s + 0x9fc) & 0xf000f000ff000000 | 0x90002000101010;
  *(ulong *)((long)__s + 0xa04) =
       *(ulong *)((long)__s + 0xa04) & 0xf000f000fffff000 | 0x190001f0000012c;
  *(ulong *)((long)__s + 0xa0c) =
       *(ulong *)((long)__s + 0xa0c) & 0xf000f000f000f000 | 0x190001f0190001f;
  *(ulong *)((long)__s + 0xa14) =
       *(ulong *)((long)__s + 0xa14) & 0xff000000f000f000 | 0x1010100190001f;
  *(uint *)((long)__s + 0xa1c) = *(uint *)((long)__s + 0xa1c) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0xa20) = *(uint *)((long)__s + 0xa20) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0xa24) = *(uint *)((long)__s + 0xa24) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0xa28) = *(uint *)((long)__s + 0xa28) & 0xf000f000 | 0x180018;
  *(uint *)((long)__s + 0xa2c) = *(uint *)((long)__s + 0xa2c) & 0xf000f000 | 0x600030;
  *(uint *)((long)__s + 0xa30) = *(uint *)((long)__s + 0xa30) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa34) = *(uint *)((long)__s + 0xa34) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa38) = *(uint *)((long)__s + 0xa38) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa3c) = *(uint *)((long)__s + 0xa3c) & 0xf000f000 | 0x190001f;
  *(undefined4 *)((long)__s + 0xa40) = 0x10101010;
  uVar28 = *(uint *)((long)__s + 0xa48) & 0xff000000;
  uVar27 = *(uint *)((long)__s + 0xa4c) & 0xff000000;
  *(uint *)((long)__s + 0xa44) = *(uint *)((long)__s + 0xa44) & 0xff000000 | 0x101010;
  *(uint *)((long)__s + 0xa48) = uVar28 | 0x101010;
  *(uint *)((long)__s + 0xa4c) = uVar27 | 0x101010;
  *(uint *)((long)__s + 0xa50) = *(uint *)((long)__s + 0xa50) & 0xf000f000 | 0x6000a0;
  *(uint *)((long)__s + 0xa54) = *(uint *)((long)__s + 0xa54) & 0xf000 | 0xb410001e;
  *(uint *)((long)__s + 0xa58) = *(uint *)((long)__s + 0xa58) & 0xf000f000 | 0x6000a0;
  *(uint *)((long)__s + 0xa5c) = *(uint *)((long)__s + 0xa5c) & 0xccccf000 | 0x3210001e;
  *(uint *)((long)__s + 0xa60) = *(uint *)((long)__s + 0xa60) & 0xff000000 | 0x61616;
  *(uint *)((long)__s + 0xa64) = *(uint *)((long)__s + 0xa64) & 0xf000f000 | 0x200040;
  *(uint *)((long)__s + 0xa68) = *(uint *)((long)__s + 0xa68) & 0xf000f000 | 0x400024;
  *(uint *)((long)__s + 0xa6c) = *(uint *)((long)__s + 0xa6c) & 0x1000f000 | 0xa0040009;
  *(uint *)((long)__s + 0xa70) = *(uint *)((long)__s + 0xa70) & 0xff00ff00 | 0x19001f;
  *(ulong *)((long)__s + 0xa74) =
       *(ulong *)((long)__s + 0xa74) & 0xff00ff001000f000 | (ulong)DAT_002b9300;
  uVar1 = (undefined1)h265e_mode_bias[*(int *)(lVar30 + 0x2b0)];
  uVar17 = CONCAT12(uVar1,CONCAT11(uVar1,uVar1));
  auVar65[3] = 0;
  auVar65._0_3_ = uVar17;
  auVar65._4_3_ = uVar17;
  auVar65[7] = 0;
  auVar65._8_3_ = uVar17;
  auVar65[0xb] = 0;
  auVar65._12_3_ = uVar17;
  auVar65[0xf] = 0;
  *(undefined1 (*) [16])((long)__s + 0x8b0) =
       auVar65 | *(undefined1 (*) [16])((long)__s + 0x8b0) & _DAT_002b9310;
  if (*(int *)(lVar30 + 0x2c0) != 0) {
    bVar34 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2c8)];
    uVar26 = 0x18;
    if (0x18 < bVar34) {
      uVar26 = (uint)bVar34;
    }
    uVar38 = (uint)bVar34;
    uVar57 = 6;
    if (uVar38 < 6) {
      uVar57 = uVar38;
    }
    auVar65 = _DAT_00277a10 ^ ZEXT516(CONCAT14(bVar34,uVar38));
    auVar66._0_4_ = -(uint)(-0x7ffffffd < auVar65._0_4_);
    auVar66._4_4_ = -(uint)(-0x7ffffff9 < auVar65._4_4_);
    auVar66._8_4_ = -(uint)(0 < auVar65._8_4_);
    auVar66._12_4_ = -(uint)(0 < auVar65._12_4_);
    auVar65 = auVar66 & _DAT_002b9330 | ~auVar66 & ZEXT516(CONCAT14(bVar34,uVar38));
    *(ulong *)((long)__s + 0x8c0) =
         CONCAT44(auVar65._4_4_ << 0x10,auVar65._0_4_ << 0x10) |
         CONCAT44(uVar57,uVar26) | *(ulong *)((long)__s + 0x8c0) & (ulong)DAT_002ad4a0;
    uVar57 = (uint)bVar34;
    uVar26 = 10;
    if (uVar38 < 10) {
      uVar26 = uVar57;
    }
    *(uint *)((long)__s + 0x8d8) = uVar26 * 0x1010100 | uVar57;
    uVar26 = 0xe;
    if (uVar57 < 0xe) {
      uVar26 = uVar57;
    }
    uVar38 = 0xf;
    if (uVar57 < 0xf) {
      uVar38 = uVar57;
    }
    *(uint *)((long)__s + 0x8dc) =
         uVar38 << 0x10 | uVar26 << 8 | (uint)*(byte *)((long)__s + 0x8df) << 0x18 | uVar26;
    *(ulong *)((long)__s + 0x8e0) =
         CONCAT44((uint)bVar34 << 8,uVar38 << 8) |
         CONCAT44((uint)bVar34 * 0x10000,(uint)bVar34 * 0x10000) |
         *(ulong *)((long)__s + 0x8e0) & DAT_002ad460 | (ulong)CONCAT14(bVar34,uVar38);
  }
  bVar34 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2a0)];
  uVar26 = 0x1a;
  if (0x1a < bVar34) {
    uVar26 = (uint)bVar34;
  }
  uVar38 = (uint)bVar34;
  uVar57 = 0x19;
  if (0x19 < uVar38) {
    uVar57 = uVar38;
  }
  *(uint *)((long)__s + 0x900) =
       uVar57 << 0x10 | uVar57 << 8 | (uint)*(byte *)((long)__s + 0x903) << 0x18 | uVar26;
  uVar26 = 0x18;
  if (0x18 < uVar38) {
    uVar26 = uVar38;
  }
  uVar31 = (uint)bVar34;
  uVar38 = 0x17;
  if (0x17 < uVar31) {
    uVar38 = uVar31;
  }
  *(uint *)((long)__s + 0x904) =
       uVar38 << 0x10 | uVar26 << 8 | (uint)*(byte *)((long)__s + 0x907) << 0x18 | uVar57;
  uVar26 = 0x15;
  if (0x15 < uVar31) {
    uVar26 = uVar31;
  }
  uVar57 = 0x13;
  if (0x13 < uVar31) {
    uVar57 = uVar31;
  }
  uVar38 = 0x12;
  if (0x12 < uVar31) {
    uVar38 = uVar31;
  }
  *(uint *)((long)__s + 0x908) =
       uVar38 << 0x10 | uVar57 << 8 | (uint)*(byte *)((long)__s + 0x90b) << 0x18 | uVar26;
  uVar26 = (uint)bVar34;
  *(uint *)((long)__s + 0x90c) =
       uVar26 << 0x10 | uVar26 << 8 | (uint)*(byte *)((long)__s + 0x90f) << 0x18 | uVar26;
  uVar1 = (undefined1)h265e_mode_bias[*(int *)(lVar30 + 0x2b4)];
  uVar17 = CONCAT12(uVar1,CONCAT11(uVar1,uVar1));
  auVar61[3] = 0;
  auVar61._0_3_ = uVar17;
  auVar61._4_3_ = uVar17;
  auVar61[7] = 0;
  auVar61._8_3_ = uVar17;
  auVar61[0xb] = 0;
  auVar61._12_3_ = uVar17;
  auVar61[0xf] = 0;
  *(undefined1 (*) [16])((long)__s + 0x928) =
       auVar61 | *(undefined1 (*) [16])((long)__s + 0x928) & _DAT_002b9310;
  if (*(int *)(lVar30 + 0x2c0) != 0) {
    bVar34 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2c8)];
    uVar26 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    if (0x17 < (int)*(uint *)(lVar30 + 0x2c4)) {
      uVar26 = 0x18;
    }
    uVar57 = *(uint *)((long)__s + 0x938);
    *(uint *)((long)__s + 0x938) = uVar57 & 0xfffff000 | uVar26;
    uVar38 = 0x40000;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 4) {
      uVar38 = (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0x938) = uVar57 & 0xf000f000 | uVar26 | uVar38;
    uVar26 = 6;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 6) {
      uVar26 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    }
    uVar57 = *(uint *)((long)__s + 0x93c);
    *(uint *)((long)__s + 0x93c) = uVar57 & 0xfffff000 | uVar26;
    *(uint *)((long)__s + 0x93c) =
         uVar57 & 0xf000f000 | uVar26 | (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    uVar26 = 0x12;
    if (0x12 < bVar34) {
      uVar26 = (uint)bVar34;
    }
    uVar38 = (uint)bVar34;
    uVar57 = 0xb;
    if (uVar38 < 0xb) {
      uVar57 = uVar38;
    }
    *(uint *)((long)__s + 0x950) = uVar57 << 0x18 | uVar57 << 0x10 | uVar57 << 8 | uVar26;
    auVar65 = _DAT_00277a10 ^ ZEXT516(CONCAT14(bVar34,uVar38));
    auVar62._0_4_ = -(uint)(-0x7ffffff4 < auVar65._0_4_);
    auVar62._4_4_ = -(uint)(-0x7ffffff2 < auVar65._4_4_);
    auVar62._8_4_ = -(uint)(0 < auVar65._8_4_);
    auVar62._12_4_ = -(uint)(0 < auVar65._12_4_);
    auVar65 = auVar62 & _DAT_002b9350 | ~auVar62 & ZEXT516(CONCAT14(bVar34,uVar38));
    *(ulong *)((long)__s + 0x954) =
         CONCAT44(auVar65._4_4_ << 0x10,auVar65._0_4_ << 0x10) | auVar65._0_8_ |
         CONCAT44(auVar65._4_4_ << 8,auVar65._0_4_ << 8) |
         *(ulong *)((long)__s + 0x954) & DAT_002ad460;
    *(uint *)((long)__s + 0x95c) =
         (uint)bVar34 << 0x10 | uVar38 << 8 | (uint)*(byte *)((long)__s + 0x95f) << 0x18 |
         (uint)bVar34;
  }
  bVar34 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2a4)];
  uVar26 = 0x1a;
  if (0x1a < bVar34) {
    uVar26 = (uint)bVar34;
  }
  uVar38 = (uint)bVar34;
  uVar57 = 0x19;
  if (0x19 < uVar38) {
    uVar57 = uVar38;
  }
  *(uint *)((long)__s + 0x978) =
       uVar57 << 0x10 | uVar57 << 8 | (uint)*(byte *)((long)__s + 0x97b) << 0x18 | uVar26;
  uVar26 = 0x18;
  if (0x18 < uVar38) {
    uVar26 = uVar38;
  }
  uVar31 = (uint)bVar34;
  uVar38 = 0x17;
  if (0x17 < uVar31) {
    uVar38 = uVar31;
  }
  uVar39 = 0x15;
  if (0x15 < uVar31) {
    uVar39 = uVar31;
  }
  *(uint *)((long)__s + 0x97c) =
       uVar38 << 0x10 | uVar26 << 8 | (uint)*(byte *)((long)__s + 0x97f) << 0x18 | uVar57;
  uVar26 = 0x13;
  if (0x13 < uVar31) {
    uVar26 = uVar31;
  }
  uVar57 = 0x12;
  if (0x12 < uVar31) {
    uVar57 = uVar31;
  }
  *(uint *)((long)__s + 0x980) =
       uVar57 << 0x10 | uVar26 << 8 | (uint)*(byte *)((long)__s + 0x983) << 0x18 | uVar39;
  *(uint *)((long)__s + 0x984) =
       (uint)bVar34 << 0x10 | (uint)bVar34 << 8 | (uint)*(byte *)((long)__s + 0x987) << 0x18 |
       (uint)bVar34;
  uVar1 = (undefined1)h265e_mode_bias[*(int *)(lVar30 + 0x2b8)];
  uVar17 = CONCAT12(uVar1,CONCAT11(uVar1,uVar1));
  auVar63[3] = 0;
  auVar63._0_3_ = uVar17;
  auVar63._4_3_ = uVar17;
  auVar63[7] = 0;
  auVar63._8_3_ = uVar17;
  auVar63[0xb] = 0;
  auVar63._12_3_ = uVar17;
  auVar63[0xf] = 0;
  *(undefined1 (*) [16])((long)__s + 0x9a0) =
       auVar63 | *(undefined1 (*) [16])((long)__s + 0x9a0) & _DAT_002b9310;
  if (*(int *)(lVar30 + 0x2c0) != 0) {
    bVar34 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2c8)];
    uVar26 = 0x18;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 0x18) {
      uVar26 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    }
    uVar57 = *(uint *)((long)__s + 0x9b0);
    *(uint *)((long)__s + 0x9b0) = uVar57 & 0xfffff000 | uVar26;
    uVar38 = 0x180000;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 0x18) {
      uVar38 = (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0x9b0) = uVar57 & 0xf000f000 | uVar26 | uVar38;
    uVar26 = 0x30;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 0x30) {
      uVar26 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    }
    uVar57 = *(uint *)((long)__s + 0x9b4);
    *(uint *)((long)__s + 0x9b4) = uVar57 & 0xfffff000 | uVar26;
    *(uint *)((long)__s + 0x9b4) =
         uVar57 & 0xf000f000 | uVar26 | (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    uVar57 = (uint)bVar34 << 8;
    uVar38 = (uint)bVar34 << 0x10;
    uVar26 = (uint)bVar34;
    *(uint *)((long)__s + 0x9c8) = uVar26 * 0x1010101;
    *(uint *)((long)__s + 0x9cc) =
         (uint)*(byte *)((long)__s + 0x9cf) << 0x18 | uVar26 | uVar57 | uVar38;
    *(uint *)((long)__s + 0x9d0) =
         (uint)*(byte *)((long)__s + 0x9d3) << 0x18 | uVar26 | uVar57 | uVar38;
    *(uint *)((long)__s + 0x9d4) =
         (uint)*(byte *)((long)__s + 0x9d7) << 0x18 | uVar26 | uVar57 | uVar38;
  }
  bVar34 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2a8)];
  uVar26 = 0x1a;
  if (0x1a < bVar34) {
    uVar26 = (uint)bVar34;
  }
  uVar38 = (uint)bVar34;
  uVar57 = 0x19;
  if (0x19 < uVar38) {
    uVar57 = uVar38;
  }
  *(uint *)((long)__s + 0x9f0) =
       uVar57 << 0x10 | uVar57 << 8 | (uint)*(byte *)((long)__s + 0x9f3) << 0x18 | uVar26;
  uVar26 = 0x18;
  if (0x18 < uVar38) {
    uVar26 = uVar38;
  }
  uVar31 = (uint)bVar34;
  uVar38 = 0x17;
  if (0x17 < uVar31) {
    uVar38 = uVar31;
  }
  *(uint *)((long)__s + 0x9f4) =
       uVar38 << 0x10 | uVar26 << 8 | (uint)*(byte *)((long)__s + 0x9f7) << 0x18 | uVar57;
  uVar26 = 0x15;
  if (0x15 < uVar31) {
    uVar26 = uVar31;
  }
  uVar57 = 0x13;
  if (0x13 < uVar31) {
    uVar57 = uVar31;
  }
  uVar38 = 0x12;
  if (0x12 < uVar31) {
    uVar38 = uVar31;
  }
  *(uint *)((long)__s + 0x9f8) =
       uVar38 << 0x10 | uVar57 << 8 | (uint)*(byte *)((long)__s + 0x9fb) << 0x18 | uVar26;
  uVar26 = (uint)bVar34;
  *(uint *)((long)__s + 0x9fc) =
       uVar26 << 0x10 | uVar26 << 8 | (uint)*(byte *)((long)__s + 0x9ff) << 0x18 | uVar26;
  uVar1 = (undefined1)h265e_mode_bias[*(int *)(lVar30 + 700)];
  uVar17 = CONCAT12(uVar1,CONCAT11(uVar1,uVar1));
  auVar64[3] = 0;
  auVar64._0_3_ = uVar17;
  auVar64._4_3_ = uVar17;
  auVar64[7] = 0;
  auVar64._8_3_ = uVar17;
  auVar64[0xb] = 0;
  auVar64._12_3_ = uVar17;
  auVar64[0xf] = 0;
  *(undefined1 (*) [16])((long)__s + 0xa18) =
       auVar64 | *(undefined1 (*) [16])((long)__s + 0xa18) & _DAT_002b9310;
  if (*(int *)(lVar30 + 0x2c0) != 0) {
    bVar34 = (byte)h265e_mode_bias[*(int *)(lVar30 + 0x2c8)];
    uVar26 = 0x18;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 0x18) {
      uVar26 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    }
    uVar57 = *(uint *)((long)__s + 0xa28);
    *(uint *)((long)__s + 0xa28) = uVar57 & 0xfffff000 | uVar26;
    uVar38 = 0x180000;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 0x18) {
      uVar38 = (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0xa28) = uVar57 & 0xf000f000 | uVar26 | uVar38;
    uVar26 = 0x30;
    if ((int)*(uint *)(lVar30 + 0x2c4) < 0x30) {
      uVar26 = *(uint *)(lVar30 + 0x2c4) & 0xfff;
    }
    uVar57 = *(uint *)((long)__s + 0xa2c);
    *(uint *)((long)__s + 0xa2c) = uVar57 & 0xfffff000 | uVar26;
    *(uint *)((long)__s + 0xa2c) =
         uVar57 & 0xf000f000 | uVar26 | (*(uint *)(lVar30 + 0x2c4) & 0xfff) << 0x10;
    *(uint *)((long)__s + 0xa40) = (uint)bVar34 * 0x1010101;
    uVar26 = (uint)bVar34 << 0x10;
    *(uint *)((long)__s + 0xa44) =
         (uint)*(byte *)((long)__s + 0xa47) << 0x18 | (uint)bVar34 | (uint)bVar34 << 8 | uVar26;
    *(uint *)((long)__s + 0xa48) = uVar28 | uVar26 | (uint)CONCAT11(bVar34,bVar34);
    *(uint *)((long)__s + 0xa4c) = uVar27 | uVar26 | (uint)CONCAT11(bVar34,bVar34);
  }
  if ((hal_h265e_debug & 1) == 0) {
    memcpy((void *)((long)__s + 0xa94),vepu580_h265_scl_cfg_vepu580_h265_scl_tab,0xa98);
  }
  else {
    _mpp_log_l(4,"hal_h265e_v580","enter\n","vepu580_h265_scl_cfg");
    RVar18 = hal_h265e_debug;
    memcpy((void *)((long)__s + 0xa94),vepu580_h265_scl_cfg_vepu580_h265_scl_tab,0xa98);
    if ((RVar18 & 1) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","leave\n","vepu580_h265_scl_cfg");
    }
  }
  memcpy((void *)((long)__s + 0x3bc),lamd_satd_qp,0xd0);
  if (*(int *)((long)hal + 0xb0) == 2) {
    lVar25 = 0;
    do {
      *(undefined1 *)((long)__s + lVar25 + 0x21c) = *(undefined1 *)(lVar30 + 0x198 + lVar25 * 4);
      *(byte *)((long)__s + lVar25 + 0x22c) = *(byte *)(lVar30 + 0x218 + lVar25 * 4) & 0x3f;
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0x10);
    pRVar40 = lamd_moda_qp;
  }
  else {
    lVar25 = 0;
    do {
      *(undefined1 *)((long)__s + lVar25 + 0x21c) = *(undefined1 *)(lVar30 + 0x1d8 + lVar25 * 4);
      *(byte *)((long)__s + lVar25 + 0x22c) = *(byte *)(lVar30 + 600 + lVar25 * 4) & 0x3f;
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0x10);
    pRVar40 = lamd_modb_qp;
  }
  memcpy((void *)((long)__s + 0x4bc),pRVar40,0xd0);
  *(uint *)((long)__s + 0x218) = *(uint *)((long)__s + 0x218) & 0xff00fffe | 0x190000;
  *(ulong *)((long)__s + 0x248) =
       *(ulong *)((long)__s + 0x248) & 0xff000000ff000000 | (ulong)DAT_002b9360;
  *(uint *)((long)__s + 0x2ec) = *(uint *)((long)__s + 0x2ec) & 0xfff00000 | 0x154ab;
  *(undefined8 *)((long)__s + 700) = 0x24001000060002;
  *(undefined8 *)((long)__s + 0x2c4) = 0x24001000060002;
  *(undefined8 *)((long)__s + 0x2d8) = 0x1a181614151617;
  *(undefined8 *)((long)__s + 0x2e0) = 0x12121112111111;
  *(ulong *)((long)__s + 0x31c) =
       *(ulong *)((long)__s + 0x31c) & 0xe0080200fffffcf8 | 0x801402000000304;
  *(ulong *)((long)__s + 0x324) =
       *(ulong *)((long)__s + 0x324) & 0xfc00fc00fc00fc00 | 0x60006000200010;
  *(ulong *)((long)__s + 0x32c) =
       *(ulong *)((long)__s + 0x32c) & 0xc0000000f0f0f000 | 0x800401008030030;
  *(ulong *)((long)__s + 0x334) =
       *(ulong *)((long)__s + 0x334) & 0xfff0f000f000f000 | 0x1001000100010;
  plVar15 = *(long **)((long)hal + 0x150);
  if (plVar15 != (long *)0x0) {
    lVar30 = *plVar15;
    lVar25 = *(long *)(lVar30 + 200);
    uVar28 = (uint)(*(int *)(lVar25 + 0x1864) != 1);
    *(uint *)((long)plVar15 + 0xc) = uVar28;
    uVar28 = uVar28 * 2 + (int)plVar15[1];
    if (uVar28 < 4) {
      lVar14 = *(long *)(*(long *)(lVar30 + 0x80) + 0x18);
      iVar37 = *(int *)(lVar25 + 0x1894);
      uVar44 = 3;
      if (iVar37 == 0) {
        uVar44 = (ulong)uVar28;
      }
      aRVar16 = lvl32_preintra_cst_wgt[uVar44];
      *(RK_U8 (*) [8])(lVar14 + 0x2d8) = aRVar16;
      *(RK_U8 (*) [8])(lVar14 + 0x2e0) = aRVar16;
      if (*(int *)(lVar25 + 0x2c0) == 0) {
        uVar44 = 3;
        if (*(int *)(*(long *)(lVar30 + 200) + 0x1894) == 0) {
          uVar44 = (ulong)uVar28;
        }
        lVar30 = *(long *)(*(long *)(lVar30 + 0x80) + 0x18);
        *(ulong *)(lVar30 + 0x8c0) =
             *(ulong *)(lVar30 + 0x8c0) & 0xf000f000f000f000 | 0x6000400020001;
        *(uint *)(lVar30 + 0x8d8) =
             skip_b64_atf_wgt[uVar44][3] * 0x1000000 +
             ((skip_b64_atf_wgt[uVar44][2] & 0xffU) << 0x10 |
             (skip_b64_atf_wgt[uVar44][1] & 0xffU) << 8) + 0x10;
        *(uint *)(lVar30 + 0x8dc) =
             (skip_b64_atf_wgt[uVar44][6] & 0xffU) << 0x10 |
             (skip_b64_atf_wgt[uVar44][5] & 0xffU) << 8 |
             (uint)*(byte *)(lVar30 + 0x8df) << 0x18 | (uint)(byte)skip_b64_atf_wgt[uVar44][4];
        *(uint *)(lVar30 + 0x8e0) =
             (skip_b64_atf_wgt[uVar44][8] & 0xffU) << 8 |
             (uint)*(byte *)(lVar30 + 0x8e3) << 0x18 | (uint)(byte)skip_b64_atf_wgt[uVar44][7] |
             0x100000;
        *(ulong *)(lVar30 + 0x8e4) =
             *(ulong *)(lVar30 + 0x8e4) & 0xf000f000ff000000 | 0x30001800101010;
        *(uint *)(lVar30 + 0x8ec) = *(uint *)(lVar30 + 0x8ec) & 0xfffff000 | 0x40;
        uVar39 = intra_b32_atf_wgt[uVar44][0] & 0xff;
        uVar32 = intra_b32_atf_wgt[uVar44][3] & 0xff;
        uVar46 = intra_b32_atf_wgt[uVar44][6] & 0xff;
        uVar48 = intra_b32_atf_wgt[uVar44][9] & 0xff;
        uVar49 = (intra_b32_atf_wgt[uVar44][1] & 0xffU) << 8;
        uVar51 = (intra_b32_atf_wgt[uVar44][4] & 0xffU) << 8;
        uVar36 = (intra_b32_atf_wgt[uVar44][7] & 0xffU) << 8;
        uVar19 = (intra_b32_atf_wgt[uVar44][10] & 0xffU) << 8;
        uVar20 = (intra_b32_atf_wgt[uVar44][2] & 0xffU) << 0x10;
        uVar29 = (intra_b32_atf_wgt[uVar44][5] & 0xffU) << 0x10;
        uVar53 = (intra_b32_atf_wgt[uVar44][8] & 0xffU) << 0x10;
        uVar41 = (intra_b32_atf_wgt[uVar44][0xb] & 0xffU) << 0x10;
        *(uint *)(lVar30 + 0x900) =
             *(uint *)(lVar30 + 0x900) & 0xff000000 | uVar39 | uVar49 | uVar20;
        *(uint *)(lVar30 + 0x904) =
             *(uint *)(lVar30 + 0x904) & 0xff000000 | uVar32 | uVar51 | uVar29;
        *(uint *)(lVar30 + 0x908) =
             *(uint *)(lVar30 + 0x908) & 0xff000000 | uVar46 | uVar36 | uVar53;
        *(uint *)(lVar30 + 0x90c) =
             *(uint *)(lVar30 + 0x90c) & 0xff000000 | uVar48 | uVar19 | uVar41;
        *(ulong *)(lVar30 + 0x938) =
             *(ulong *)(lVar30 + 0x938) & 0xf000f000f000f000 | 0x6000400020001;
        *(uint *)(lVar30 + 0x950) =
             (skip_b32_atf_wgt[uVar44][2] & 0xffU) << 0x10 |
             (skip_b32_atf_wgt[uVar44][1] & 0xffU) << 8 | (uint)(byte)skip_b32_atf_wgt[uVar44][0] |
             skip_b32_atf_wgt[uVar44][3] << 0x18;
        *(uint *)(lVar30 + 0x954) =
             (skip_b32_atf_wgt[uVar44][6] & 0xffU) << 0x10 |
             (skip_b32_atf_wgt[uVar44][5] & 0xffU) << 8 |
             (uint)*(byte *)(lVar30 + 0x957) << 0x18 | (uint)(byte)skip_b32_atf_wgt[uVar44][4];
        *(uint *)(lVar30 + 0x958) =
             (skip_b32_atf_wgt[uVar44][8] & 0xffU) << 8 |
             (uint)*(byte *)(lVar30 + 0x95b) << 0x18 | (uint)(byte)skip_b32_atf_wgt[uVar44][7] |
             0x100000;
        *(ulong *)(lVar30 + 0x95c) =
             *(ulong *)(lVar30 + 0x95c) & 0xf000f000ff000000 | 0x30001800101010;
        *(uint *)(lVar30 + 0x964) = *(uint *)(lVar30 + 0x964) & 0xfffff000 | 0x40;
        *(uint *)(lVar30 + 0x978) =
             *(uint *)(lVar30 + 0x978) & 0xff000000 | uVar39 | uVar49 | uVar20;
        *(uint *)(lVar30 + 0x97c) =
             *(uint *)(lVar30 + 0x97c) & 0xff000000 | uVar32 | uVar51 | uVar29;
        *(uint *)(lVar30 + 0x980) =
             *(uint *)(lVar30 + 0x980) & 0xff000000 | uVar46 | uVar36 | uVar53;
        *(uint *)(lVar30 + 0x984) =
             *(uint *)(lVar30 + 0x984) & 0xff000000 | uVar48 | uVar19 | uVar41;
        *(ulong *)(lVar30 + 0x9b0) =
             *(ulong *)(lVar30 + 0x9b0) & 0xf000f000f000f000 | 0x6000400020001;
        iVar58 = skip_b16_atf_wgt[uVar44][3] * 0x1000000 +
                 ((skip_b16_atf_wgt[uVar44][2] & 0xffU) << 0x10 |
                 (skip_b16_atf_wgt[uVar44][1] & 0xffU) << 8) + 0x10;
        *(int *)(lVar30 + 0x9c8) = iVar58;
        uVar31 = (uint)(byte)skip_b16_atf_wgt[uVar44][4];
        uVar57 = (skip_b16_atf_wgt[uVar44][5] & 0xffU) << 8;
        uVar38 = (skip_b16_atf_wgt[uVar44][6] & 0xffU) << 0x10;
        *(uint *)(lVar30 + 0x9cc) =
             (uint)*(byte *)(lVar30 + 0x9cf) << 0x18 | uVar31 | uVar57 | uVar38;
        uVar26 = (skip_b16_atf_wgt[uVar44][8] & 0xffU) << 8;
        uVar27 = (uint)(byte)skip_b16_atf_wgt[uVar44][7];
        *(uint *)(lVar30 + 0x9d0) =
             (uint)*(byte *)(lVar30 + 0x9d3) << 0x18 | uVar27 | uVar26 | 0x100000;
        *(ulong *)(lVar30 + 0x9d4) =
             *(ulong *)(lVar30 + 0x9d4) & 0xf000f000ff000000 | 0x30001800101010;
        *(uint *)(lVar30 + 0x9dc) = *(uint *)(lVar30 + 0x9dc) & 0xfffff000 | 0x40;
        *(uint *)(lVar30 + 0x9f0) =
             *(uint *)(lVar30 + 0x9f0) & 0xff000000 | uVar39 | uVar49 | uVar20;
        *(uint *)(lVar30 + 0x9f4) =
             *(uint *)(lVar30 + 0x9f4) & 0xff000000 | uVar32 | uVar51 | uVar29;
        *(uint *)(lVar30 + 0x9f8) =
             *(uint *)(lVar30 + 0x9f8) & 0xff000000 | uVar46 | uVar36 | uVar53;
        *(uint *)(lVar30 + 0x9fc) =
             *(uint *)(lVar30 + 0x9fc) & 0xff000000 | uVar48 | uVar19 | uVar41;
        *(ulong *)(lVar30 + 0xa28) =
             *(ulong *)(lVar30 + 0xa28) & 0xf000f000f000f000 | 0x6000400020001;
        *(int *)(lVar30 + 0xa40) = iVar58;
        *(uint *)(lVar30 + 0xa44) =
             (uint)*(byte *)(lVar30 + 0xa47) << 0x18 | uVar31 | uVar57 | uVar38;
        *(uint *)(lVar30 + 0xa48) =
             (uint)*(byte *)(lVar30 + 0xa4b) << 0x18 | uVar27 | uVar26 | 0x100000;
        *(uint *)(lVar30 + 0xa4c) = (uint)*(byte *)(lVar30 + 0xa4f) << 0x18 | 0x101010;
      }
      uVar26 = (uint)(byte)pre_intra_b32_cost[uVar28][0];
      uVar27 = (pre_intra_b32_cost[uVar28][1] & 0xffU) << 0x10;
      *(uint *)(lVar14 + 0xa70) = *(uint *)(lVar14 + 0xa70) & 0xff00ff00 | uVar26 | uVar27;
      *(uint *)(lVar14 + 0xa78) = *(uint *)(lVar14 + 0xa78) & 0xff00ff00 | uVar26 | uVar27;
      *(ulong *)(lVar14 + 0x248) =
           *(ulong *)(lVar14 + 0x248) & 0xff000000ff000000 | (ulong)DAT_002b93e0;
      *(uint *)(lVar14 + 0x31c) =
           (*(uint *)(lVar14 + 0x31c) & 0xfffffffb) + (uint)((int)plVar15[1] == 0) * 4;
      *(ulong *)(lVar14 + 0x324) =
           CONCAT44(cime_multi[uVar28][3] << 0x10,4) & 0x3ff0000ffffffff |
           *(ulong *)(lVar14 + 0x324) & (ulong)DAT_002ad640 |
           CONCAT44(cime_multi[uVar28][2],cime_multi[uVar28][1] << 0x10) & (ulong)DAT_002ad630;
      *(uint *)(lVar14 + 0x330) =
           (rime_multi[uVar28][2] & 0x3ffU) * 0x100000 +
           (*(uint *)(lVar14 + 0x330) & 0xc0000000 | (rime_multi[uVar28][1] & 0x3ffU) << 10) + 4;
      if ((int)plVar15[1] != 0) {
        *(uint *)(lVar14 + 0x338) = *(uint *)(lVar14 + 0x338) & 0xfff0ffff | 0x80000;
      }
      if (iVar37 == 0) {
        uVar26 = *(uint *)(lVar14 + 0x894) & 0xfffffffe | (uint)((int)plVar15[1] == 0);
        *(uint *)(lVar14 + 0x894) = uVar26;
        uVar27 = (uint)((int)plVar15[1] == 0) * 2;
      }
      else {
        uVar26 = *(uint *)(lVar14 + 0x894) & 0xfffffffe;
        uVar27 = 0;
      }
      *(uint *)(lVar14 + 0x894) = uVar26 & 0xfffffffd | uVar27;
      *(RK_U32 *)(lVar14 + 0x7c0) =
           (intra_lvl16_sobel_a[uVar28][4] & 0x3f) << 0x18 |
           (intra_lvl16_sobel_a[uVar28][3] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_a[uVar28][2] & 0x3f) << 0xc |
           (intra_lvl16_sobel_a[uVar28][1] & 0x3f) << 6 |
           *(uint *)(lVar14 + 0x7c0) & 0xc0000000 | intra_lvl16_sobel_a[uVar28][0] & 0x3f;
      *(RK_U32 *)(lVar14 + 0x7c4) =
           (intra_lvl16_sobel_a[uVar28][8] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_a[uVar28][7] & 0x3f) << 0xc |
           (intra_lvl16_sobel_a[uVar28][6] & 0x3f) << 6 |
           intra_lvl16_sobel_a[uVar28][5] & 0x3f | (uint)*(byte *)(lVar14 + 0x7c7) << 0x18;
      *(RK_U32 *)(lVar14 + 0x7dc) =
           (intra_lvl16_sobel_c[uVar28][4] & 0x3f) << 0x18 |
           (intra_lvl16_sobel_c[uVar28][3] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_c[uVar28][2] & 0x3f) << 0xc |
           (intra_lvl16_sobel_c[uVar28][1] & 0x3f) << 6 |
           *(uint *)(lVar14 + 0x7dc) & 0xc0000000 | intra_lvl16_sobel_c[uVar28][0] & 0x3f;
      *(RK_U32 *)(lVar14 + 0x7e0) =
           (intra_lvl16_sobel_c[uVar28][8] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_c[uVar28][7] & 0x3f) << 0xc |
           (intra_lvl16_sobel_c[uVar28][6] & 0x3f) << 6 |
           intra_lvl16_sobel_c[uVar28][5] & 0x3f | (uint)*(byte *)(lVar14 + 0x7e3) << 0x18;
      uVar27 = intra_lvl16_sobel_d[uVar28][6];
      uVar26 = intra_lvl16_sobel_d[uVar28][4];
      uVar57 = intra_lvl16_sobel_d[uVar28][2];
      uVar38 = intra_lvl16_sobel_d[uVar28][7];
      uVar31 = intra_lvl16_sobel_d[uVar28][5];
      uVar39 = intra_lvl16_sobel_d[uVar28][3];
      *(RK_U32 *)(lVar14 + 0x7e4) =
           (intra_lvl16_sobel_d[uVar28][1] & 0x7fff) << 0x10 |
           *(uint *)(lVar14 + 0x7e4) & 0x80008000 | intra_lvl16_sobel_d[uVar28][0] & 0x7fff;
      *(uint *)(lVar14 + 0x7e8) =
           (uVar39 & 0x7fff) << 0x10 | *(uint *)(lVar14 + 0x7e8) & 0x80008000 | uVar57 & 0x7fff;
      *(uint *)(lVar14 + 0x7ec) =
           (uVar31 & 0x7fff) << 0x10 | *(uint *)(lVar14 + 0x7ec) & 0x80008000 | uVar26 & 0x7fff;
      *(uint *)(lVar14 + 0x7f0) =
           (uVar38 & 0x7fff) << 0x10 | *(uint *)(lVar14 + 0x7f0) & 0x80008000 | uVar27 & 0x7fff;
      *(uint *)(lVar14 + 0x7f4) =
           *(uint *)(lVar14 + 0x7f4) & 0xffff8000 | intra_lvl16_sobel_d[uVar28][8] & 0x7fff;
      *(RK_U32 *)(lVar14 + 0x84c) =
           (intra_lvl32_sobel_a[uVar28][4] & 0x3f) << 0x18 |
           (intra_lvl32_sobel_a[uVar28][3] & 0x3f) << 0x12 |
           (intra_lvl32_sobel_a[uVar28][2] & 0x3f) << 0xc |
           (intra_lvl32_sobel_a[uVar28][1] & 0x3f) << 6 |
           *(uint *)(lVar14 + 0x84c) & 0xc0000000 | intra_lvl32_sobel_a[uVar28][0] & 0x3f;
      *(uint *)(lVar14 + 0x85c) = *(uint *)(lVar14 + 0x85c) & 0xc0000000 | 0x10410410;
      if (*(int *)(lVar25 + 0x18c) == 0) {
        *(RK_U32 *)(lVar14 + 0x2ec) =
             (qnt_bias_p[uVar28] & 0x3ff) * 0x400 + (*(uint *)(lVar14 + 0x2ec) & 0xfff00000) + 0x80;
      }
      else {
        uVar27 = 0xab;
        if (*(uint *)(lVar25 + 0x184) != 0) {
          uVar27 = *(uint *)(lVar25 + 0x184) & 0x3ff;
        }
        uVar26 = *(uint *)(lVar14 + 0x2ec);
        *(uint *)(lVar14 + 0x2ec) = uVar26 & 0xfffffc00 | uVar27;
        uVar57 = 0x15400;
        if (*(uint *)(lVar25 + 0x188) != 0) {
          uVar57 = (*(uint *)(lVar25 + 0x188) & 0x3ff) << 10;
        }
        *(uint *)(lVar14 + 0x2ec) = uVar26 & 0xfff00000 | uVar27 | uVar57;
      }
      *(uint *)(lVar14 + 0x32c) =
           *(uint *)(lVar14 + 0x32c) & 0xfffff000 | rime_sqi_cime_sad_th[uVar28] & 0xfff;
      uVar27 = fme_sqi_cime_sad_pu16_th[uVar28] & 0xfff;
      *(RK_U32 *)(lVar14 + 0x334) =
           (fme_sqi_cime_sad_pu16_th[uVar28] & 0xfff) << 0x10 |
           *(uint *)(lVar14 + 0x334) & 0xf000f000 | uVar27;
      *(uint *)(lVar14 + 0x338) = *(uint *)(lVar14 + 0x338) & 0xfffff000 | uVar27;
      *(uint *)(lVar14 + 600) = *(uint *)(lVar14 + 600) & 0xfffffff8 | chrm_klut_ofst[uVar28] & 7;
    }
    else {
      _mpp_log_l(2,"hal_h265e_v580","scene_motion_flag is a wrong value %d\n",
                 "vepu580_h265e_tune_reg_patch");
    }
  }
  uVar6 = *(undefined4 *)(lVar9 + 0x28);
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","enter\n","vepu580_setup_split");
  }
  iVar37 = *(int *)(lVar11 + 0xe94);
  if (iVar37 == 2) {
    iVar37 = *(int *)(lVar11 + 0xc);
    iVar58 = *(int *)(lVar11 + 0x10);
    uVar28 = *(uint *)(lVar11 + 0xe98);
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48003;
    *(uint *)((long)__s + 0x148) =
         *(uint *)((long)__s + 0x148) & 0xfff00000 | *(int *)(lVar11 + 0xe98) - 1U & 0xfffff;
    *(uint *)((long)__s + 0x144) = *(uint *)((long)__s + 0x144) & 0xfff00000;
    iVar7 = *(int *)(lVar11 + 0xe9c);
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xbfffffff | (uint)(iVar7 != 0) << 0x1e;
    if (((*(byte *)(lVar11 + 0xe9c) & 1) != 0) ||
       ((bVar34 = (byte)uVar6 >> 7, iVar7 != 0 &&
        (0x20 < (uint)(CONCAT44(0 >> bVar34,
                                (iVar58 + 0x3f >> 6) * ((uint)(iVar37 + 0x3f >> 6) >> bVar34) +
                                uVar28 + -1) / (ulong)uVar28))))) {
      *(byte *)((long)__s + 0x20) = *(byte *)((long)__s + 0x20) | 8;
    }
  }
  else if (iVar37 == 1) {
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48001;
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(uint *)((long)__s + 0x144) =
         *(uint *)((long)__s + 0x144) & 0xfff00000 | *(uint *)(lVar11 + 0xe98) & 0xfffff;
    uVar28 = (uint)(*(int *)(lVar11 + 0xe9c) != 0) << 0x1e;
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xbfffffff | uVar28;
    *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffff7 | uVar28 >> 0x1b;
  }
  else if (iVar37 == 0) {
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(ulong *)((long)__s + 0x140) = *(ulong *)((long)__s + 0x140) & 0xfff0000080007ff8;
    *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) & 0xbf;
  }
  else {
    _mpp_log_l(4,"hal_h265e_v580","invalide slice split mode %d\n","vepu580_setup_split");
  }
  *(undefined4 *)(lVar11 + 0xe90) = 0;
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","leave\n","vepu580_setup_split");
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0xb07);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v580_gen_regs(void *hal, HalEncTask *task)
{
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    HalEncTask *enc_task = task;
    EncRcTask *rc_task = enc_task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    H265eSyntax_new *syn = ctx->syn;
    Vepu580H265eFrmCfg *frm_cfg = ctx->frm;
    H265eV580RegSet *regs = frm_cfg->regs_set[0];
    RK_U32 pic_width_align8, pic_height_align8;
    RK_S32 pic_wd64, pic_h64;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    hevc_vepu580_control_cfg *reg_ctl = &regs->reg_ctl;
    hevc_vepu580_base        *reg_base = &regs->reg_base;
    hevc_vepu580_rc_klut *reg_klut = &regs->reg_rc_klut;
    MppEncCfgSet *cfg = ctx->cfg;

    hal_h265e_enter();
    pic_width_align8 = (syn->pp.pic_width + 7) & (~7);
    pic_height_align8 = (syn->pp.pic_height + 7) & (~7);
    pic_wd64 = (syn->pp.pic_width + 63) / 64;
    pic_h64 = (syn->pp.pic_height + 63) / 64;

    hal_h265e_dbg_simple("frame %d | type %d | start gen regs",
                         frm_cfg->frame_count, ctx->frame_type);

    memset(regs, 0, sizeof(H265eV580RegSet));

    if (ctx->task_cnt > 1)
        setup_vepu580_dual_core(ctx);

    reg_ctl->reg0004_enc_strt.lkt_num      = 0;
    reg_ctl->reg0004_enc_strt.vepu_cmd     = ctx->enc_mode;
    reg_ctl->reg0005_enc_clr.safe_clr      = 0x0;
    reg_ctl->reg0005_enc_clr.force_clr     = 0x0;

    reg_ctl->reg0008_int_en.enc_done_en         = 1;
    reg_ctl->reg0008_int_en.lkt_node_done_en    = 1;
    reg_ctl->reg0008_int_en.sclr_done_en        = 1;
    reg_ctl->reg0008_int_en.slc_done_en         = 0;
    reg_ctl->reg0008_int_en.bsf_oflw_en         = 1;
    reg_ctl->reg0008_int_en.brsp_otsd_en        = 1;
    reg_ctl->reg0008_int_en.wbus_err_en         = 1;
    reg_ctl->reg0008_int_en.rbus_err_en         = 1;
    reg_ctl->reg0008_int_en.wdg_en              = 1;
    reg_ctl->reg0008_int_en.lkt_err_int_en      = 0;

    reg_ctl->reg0012_dtrns_map.lpfw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.cmvw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.dspw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.rfpw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.src_bus_edin     = 0x0;
    reg_ctl->reg0012_dtrns_map.meiw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.bsw_bus_edin     = 0x7;
    reg_ctl->reg0012_dtrns_map.lktr_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.roir_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.lktw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.afbc_bsize       = 0x1;
    reg_ctl->reg0012_dtrns_map.ebufw_bus_ordr   = 0x0;

    reg_ctl->reg0013_dtrns_cfg.dspr_otsd        = (ctx->frame_type == INTER_P_FRAME);
    reg_ctl->reg0013_dtrns_cfg.axi_brsp_cke     = 0x0;
    reg_ctl->reg0014_enc_wdg.vs_load_thd        = 0x1fffff;
    reg_ctl->reg0014_enc_wdg.rfp_load_thd       = 0;

    reg_ctl->reg0021_func_en.cke                = 1;
    reg_ctl->reg0021_func_en.resetn_hw_en       = 1;
    reg_ctl->reg0021_func_en.enc_done_tmvp_en   = 1;

    reg_base->reg0196_enc_rsl.pic_wd8_m1    = pic_width_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_wfill    = (syn->pp.pic_width & 0x7)
                                              ? (8 - (syn->pp.pic_width & 0x7)) : 0;
    reg_base->reg0196_enc_rsl.pic_hd8_m1    = pic_height_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_hfill    = (syn->pp.pic_height & 0x7)
                                              ? (8 - (syn->pp.pic_height & 0x7)) : 0;

    reg_base->reg0192_enc_pic.enc_stnd      = 1; //H265
    reg_base->reg0192_enc_pic.cur_frm_ref   = !syn->sp.non_reference_flag; //current frame will be refered
    reg_base->reg0192_enc_pic.bs_scp        = 1;
    reg_base->reg0192_enc_pic.log2_ctu_num  = ceil(log2((double)pic_wd64 * pic_h64));

    reg_base->reg0203_src_proc.src_mirr = 0;
    reg_base->reg0203_src_proc.src_rot  = 0;
    reg_base->reg0203_src_proc.txa_en   = 1;
    reg_base->reg0203_src_proc.afbcd_en = (MPP_FRAME_FMT_IS_FBC(syn->pp.mpp_format)) ? 1 : 0;

    reg_klut->klut_ofst.chrm_klut_ofst = (ctx->frame_type == INTRA_FRAME) ? 0 : 3;
    memcpy(&reg_klut->klut_wgt0, &klut_weight[0], sizeof(klut_weight));

    vepu580_h265_set_me_regs(ctx, syn, reg_base);

    reg_base->reg0232_rdo_cfg.chrm_spcl   = 1;
    reg_base->reg0232_rdo_cfg.cu_inter_e    = 0x06db;
    reg_base->reg0232_rdo_cfg.cu_intra_e    = 0xf;

    if (syn->pp.num_long_term_ref_pics_sps) {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 1;
    } else {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 0;
    }

    reg_base->reg0232_rdo_cfg.ccwa_e = 1;
    reg_base->reg0232_rdo_cfg.scl_lst_sel = syn->pp.scaling_list_enabled_flag;
    {
        RK_U32 i_nal_type = 0;

        /* TODO: extend syn->frame_coding_type definition */
        if (ctx->frame_type == INTRA_FRAME) {
            /* reset ref pictures */
            i_nal_type    = NAL_IDR_W_RADL;
        } else if (ctx->frame_type == INTER_P_FRAME ) {
            i_nal_type    = NAL_TRAIL_R;
        } else {
            i_nal_type    = NAL_TRAIL_R;
        }

        reg_base->reg0236_synt_nal.nal_unit_type    = syn->sp.temporal_id ? NAL_TSA_R : i_nal_type;
    }

    vepu580_h265_set_hw_address(ctx, task);
    vepu580_h265_set_pp_regs(regs, fmt, &ctx->cfg->prep, task);
    vepu580_h265_set_rc_regs(ctx, regs, task);
    vepu580_h265_set_slice_regs(syn, reg_base);
    vepu580_h265_set_ref_regs(syn, reg_base);

    vepu580_set_osd(&ctx->frm->osd_cfg);
    /* ROI configure */
    vepu580_h265_set_roi_regs(ctx, reg_base);
    if (frm->is_i_refresh)
        setup_intra_refresh(ctx, frm->seq_idx % ctx->cfg->rc.gop);

    if (cfg->tune.deblur_en && (!rc_task->info.complex_scene) &&
        cfg->rc.rc_mode == MPP_ENC_RC_MODE_SMTRC && task->md_info &&
        cfg->tune.scene_mode == MPP_ENC_SCENE_MODE_IPC) {
        if (MPP_OK != vepu580_setup_qpmap_buf(ctx))
            mpp_err("qpmap malloc buffer failed!\n");
    }

    /*paramet cfg*/
    vepu580_h265_global_cfg_set(ctx, regs);

    vepu580_h265e_tune_reg_patch(ctx->tune);

    vepu580_setup_split(regs, cfg, syn->pp.tiles_enabled_flag);

    hal_h265e_leave();
    return MPP_OK;
}